

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  byte bVar53;
  byte bVar54;
  byte bVar55;
  byte bVar56;
  ulong uVar57;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar58;
  byte bVar59;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  ulong uVar60;
  byte bVar61;
  ulong uVar62;
  undefined8 unaff_R13;
  ulong uVar63;
  bool bVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  uint uVar67;
  uint uVar129;
  uint uVar130;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  uint uVar131;
  uint uVar135;
  undefined1 auVar126 [32];
  undefined1 auVar76 [16];
  undefined1 auVar127 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar128 [32];
  float pp;
  float fVar136;
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar151;
  float fVar152;
  undefined4 uVar153;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar160 [16];
  undefined1 auVar164 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar205 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar211 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar220 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar228 [16];
  undefined1 auVar230 [32];
  undefined1 auVar227 [16];
  undefined1 auVar231 [32];
  undefined1 auVar229 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  undefined1 auVar241 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar242 [64];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [28];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [32];
  float fVar253;
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 in_ZMM31 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_adc;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  RTCFilterFunctionNArguments local_8d0;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  ulong local_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  RTCHitN local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  
  uVar57 = (ulong)(byte)prim[1];
  fVar253 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar77 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar78 = vsubps_avx(auVar70,*(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  fVar200 = fVar253 * auVar78._0_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar57 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar70);
  fVar136 = fVar253 * auVar77._0_4_;
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar57 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar12);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar57 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar57 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar72);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar57 * 0xc + 6);
  auVar89 = vpmovsxbd_avx2(auVar68);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar57 * 0xd + 6);
  auVar85 = vpmovsxbd_avx2(auVar73);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar57 * 0x12 + 6);
  auVar90 = vpmovsxbd_avx2(auVar74);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar57 * 0x13 + 6);
  auVar91 = vpmovsxbd_avx2(auVar69);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar57 * 0x14 + 6);
  auVar93 = vpmovsxbd_avx2(auVar75);
  auVar92 = vcvtdq2ps_avx(auVar93);
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar102._4_4_ = fVar136;
  auVar102._0_4_ = fVar136;
  auVar102._8_4_ = fVar136;
  auVar102._12_4_ = fVar136;
  auVar102._16_4_ = fVar136;
  auVar102._20_4_ = fVar136;
  auVar102._24_4_ = fVar136;
  auVar102._28_4_ = fVar136;
  auVar83 = ZEXT1632(CONCAT412(fVar253 * auVar77._12_4_,
                               CONCAT48(fVar253 * auVar77._8_4_,
                                        CONCAT44(fVar253 * auVar77._4_4_,fVar136))));
  auVar94 = vpermps_avx2(auVar104,auVar83);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar82 = vpermps_avx512vl(auVar81,auVar83);
  fVar136 = auVar82._0_4_;
  auVar224._0_4_ = fVar136 * auVar87._0_4_;
  fVar151 = auVar82._4_4_;
  auVar224._4_4_ = fVar151 * auVar87._4_4_;
  fVar165 = auVar82._8_4_;
  auVar224._8_4_ = fVar165 * auVar87._8_4_;
  fVar167 = auVar82._12_4_;
  auVar224._12_4_ = fVar167 * auVar87._12_4_;
  fVar169 = auVar82._16_4_;
  auVar224._16_4_ = fVar169 * auVar87._16_4_;
  fVar137 = auVar82._20_4_;
  auVar224._20_4_ = fVar137 * auVar87._20_4_;
  fVar171 = auVar82._24_4_;
  auVar224._28_36_ = in_ZMM4._28_36_;
  auVar224._24_4_ = fVar171 * auVar87._24_4_;
  auVar83._4_4_ = auVar85._4_4_ * fVar151;
  auVar83._0_4_ = auVar85._0_4_ * fVar136;
  auVar83._8_4_ = auVar85._8_4_ * fVar165;
  auVar83._12_4_ = auVar85._12_4_ * fVar167;
  auVar83._16_4_ = auVar85._16_4_ * fVar169;
  auVar83._20_4_ = auVar85._20_4_ * fVar137;
  auVar83._24_4_ = auVar85._24_4_ * fVar171;
  auVar83._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = fVar151 * auVar92._4_4_;
  auVar93._0_4_ = fVar136 * auVar92._0_4_;
  auVar93._8_4_ = fVar165 * auVar92._8_4_;
  auVar93._12_4_ = fVar167 * auVar92._12_4_;
  auVar93._16_4_ = fVar169 * auVar92._16_4_;
  auVar93._20_4_ = fVar137 * auVar92._20_4_;
  auVar93._24_4_ = fVar171 * auVar92._24_4_;
  auVar93._28_4_ = auVar82._28_4_;
  auVar70 = vfmadd231ps_fma(auVar224._0_32_,auVar94,auVar84);
  auVar12 = vfmadd231ps_fma(auVar83,auVar94,auVar89);
  auVar71 = vfmadd231ps_fma(auVar93,auVar91,auVar94);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar102,auVar86);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar102,auVar88);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar90,auVar102);
  auVar103._4_4_ = fVar200;
  auVar103._0_4_ = fVar200;
  auVar103._8_4_ = fVar200;
  auVar103._12_4_ = fVar200;
  auVar103._16_4_ = fVar200;
  auVar103._20_4_ = fVar200;
  auVar103._24_4_ = fVar200;
  auVar103._28_4_ = fVar200;
  auVar94 = ZEXT1632(CONCAT412(fVar253 * auVar78._12_4_,
                               CONCAT48(fVar253 * auVar78._8_4_,
                                        CONCAT44(fVar253 * auVar78._4_4_,fVar200))));
  auVar93 = vpermps_avx2(auVar104,auVar94);
  auVar83 = vpermps_avx512vl(auVar81,auVar94);
  fVar253 = auVar83._0_4_;
  fVar136 = auVar83._4_4_;
  auVar94._4_4_ = fVar136 * auVar87._4_4_;
  auVar94._0_4_ = fVar253 * auVar87._0_4_;
  fVar151 = auVar83._8_4_;
  auVar94._8_4_ = fVar151 * auVar87._8_4_;
  fVar165 = auVar83._12_4_;
  auVar94._12_4_ = fVar165 * auVar87._12_4_;
  fVar167 = auVar83._16_4_;
  auVar94._16_4_ = fVar167 * auVar87._16_4_;
  fVar169 = auVar83._20_4_;
  auVar94._20_4_ = fVar169 * auVar87._20_4_;
  fVar137 = auVar83._24_4_;
  auVar94._24_4_ = fVar137 * auVar87._24_4_;
  auVar94._28_4_ = auVar87._28_4_;
  auVar97._0_4_ = fVar253 * auVar85._0_4_;
  auVar97._4_4_ = fVar136 * auVar85._4_4_;
  auVar97._8_4_ = fVar151 * auVar85._8_4_;
  auVar97._12_4_ = fVar165 * auVar85._12_4_;
  auVar97._16_4_ = fVar167 * auVar85._16_4_;
  auVar97._20_4_ = fVar169 * auVar85._20_4_;
  auVar97._24_4_ = fVar137 * auVar85._24_4_;
  auVar97._28_4_ = 0;
  auVar85._4_4_ = fVar136 * auVar92._4_4_;
  auVar85._0_4_ = fVar253 * auVar92._0_4_;
  auVar85._8_4_ = fVar151 * auVar92._8_4_;
  auVar85._12_4_ = fVar165 * auVar92._12_4_;
  auVar85._16_4_ = fVar167 * auVar92._16_4_;
  auVar85._20_4_ = fVar169 * auVar92._20_4_;
  auVar85._24_4_ = fVar137 * auVar92._24_4_;
  auVar85._28_4_ = auVar92._28_4_;
  auVar72 = vfmadd231ps_fma(auVar94,auVar93,auVar84);
  auVar68 = vfmadd231ps_fma(auVar97,auVar93,auVar89);
  auVar73 = vfmadd231ps_fma(auVar85,auVar93,auVar91);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar103,auVar86);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar103,auVar88);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar103,auVar90);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar70),auVar99);
  uVar63 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar81._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar70._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar12),auVar99);
  uVar63 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar82._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar12._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar71),auVar99);
  uVar63 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar64 = (bool)((byte)uVar63 & 1);
  auVar86._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._0_4_;
  bVar64 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._4_4_;
  bVar64 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._8_4_;
  bVar64 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar81);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar81,auVar84,auVar100);
  auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar12 = vfnmadd213ps_fma(auVar82,auVar84,auVar100);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar86);
  auVar71 = vfnmadd213ps_fma(auVar86,auVar84,auVar100);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar84,auVar84);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar72));
  auVar90._4_4_ = auVar70._4_4_ * auVar86._4_4_;
  auVar90._0_4_ = auVar70._0_4_ * auVar86._0_4_;
  auVar90._8_4_ = auVar70._8_4_ * auVar86._8_4_;
  auVar90._12_4_ = auVar70._12_4_ * auVar86._12_4_;
  auVar90._16_4_ = auVar86._16_4_ * 0.0;
  auVar90._20_4_ = auVar86._20_4_ * 0.0;
  auVar90._24_4_ = auVar86._24_4_ * 0.0;
  auVar90._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar72));
  auVar98._0_4_ = auVar70._0_4_ * auVar86._0_4_;
  auVar98._4_4_ = auVar70._4_4_ * auVar86._4_4_;
  auVar98._8_4_ = auVar70._8_4_ * auVar86._8_4_;
  auVar98._12_4_ = auVar70._12_4_ * auVar86._12_4_;
  auVar98._16_4_ = auVar86._16_4_ * 0.0;
  auVar98._20_4_ = auVar86._20_4_ * 0.0;
  auVar98._24_4_ = auVar86._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 0xe + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar68));
  auVar91._4_4_ = auVar12._4_4_ * auVar86._4_4_;
  auVar91._0_4_ = auVar12._0_4_ * auVar86._0_4_;
  auVar91._8_4_ = auVar12._8_4_ * auVar86._8_4_;
  auVar91._12_4_ = auVar12._12_4_ * auVar86._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * 0.0;
  auVar91._20_4_ = auVar86._20_4_ * 0.0;
  auVar91._24_4_ = auVar86._24_4_ * 0.0;
  auVar91._28_4_ = auVar86._28_4_;
  auVar85 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar68));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 0x15 + 6));
  auVar96._0_4_ = auVar12._0_4_ * auVar86._0_4_;
  auVar96._4_4_ = auVar12._4_4_ * auVar86._4_4_;
  auVar96._8_4_ = auVar12._8_4_ * auVar86._8_4_;
  auVar96._12_4_ = auVar12._12_4_ * auVar86._12_4_;
  auVar96._16_4_ = auVar86._16_4_ * 0.0;
  auVar96._20_4_ = auVar86._20_4_ * 0.0;
  auVar96._24_4_ = auVar86._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar86 = vcvtdq2ps_avx(auVar84);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar92._4_4_ = auVar86._4_4_ * auVar71._4_4_;
  auVar92._0_4_ = auVar86._0_4_ * auVar71._0_4_;
  auVar92._8_4_ = auVar86._8_4_ * auVar71._8_4_;
  auVar92._12_4_ = auVar86._12_4_ * auVar71._12_4_;
  auVar92._16_4_ = auVar86._16_4_ * 0.0;
  auVar92._20_4_ = auVar86._20_4_ * 0.0;
  auVar92._24_4_ = auVar86._24_4_ * 0.0;
  auVar92._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar57 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar95._0_4_ = auVar71._0_4_ * auVar86._0_4_;
  auVar95._4_4_ = auVar71._4_4_ * auVar86._4_4_;
  auVar95._8_4_ = auVar71._8_4_ * auVar86._8_4_;
  auVar95._12_4_ = auVar71._12_4_ * auVar86._12_4_;
  auVar95._16_4_ = auVar86._16_4_ * 0.0;
  auVar95._20_4_ = auVar86._20_4_ * 0.0;
  auVar95._24_4_ = auVar86._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar90,auVar98);
  auVar84 = vpminsd_avx2(auVar91,auVar96);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar95);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar87._4_4_ = uVar153;
  auVar87._0_4_ = uVar153;
  auVar87._8_4_ = uVar153;
  auVar87._12_4_ = uVar153;
  auVar87._16_4_ = uVar153;
  auVar87._20_4_ = uVar153;
  auVar87._24_4_ = uVar153;
  auVar87._28_4_ = uVar153;
  auVar84 = vmaxps_avx512vl(auVar84,auVar87);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_260 = vmulps_avx512vl(auVar86,auVar84);
  auVar86 = vpmaxsd_avx2(auVar90,auVar98);
  auVar84 = vpmaxsd_avx2(auVar91,auVar96);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar95);
  uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar88._4_4_ = uVar153;
  auVar88._0_4_ = uVar153;
  auVar88._8_4_ = uVar153;
  auVar88._12_4_ = uVar153;
  auVar88._16_4_ = uVar153;
  auVar88._20_4_ = uVar153;
  auVar88._24_4_ = uVar153;
  auVar88._28_4_ = uVar153;
  auVar84 = vminps_avx512vl(auVar84,auVar88);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar89);
  uVar13 = vcmpps_avx512vl(local_260,auVar86,2);
  uVar15 = vpcmpgtd_avx512vl(auVar85,_DAT_01fb4ba0);
  uVar63 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar13 & (byte)uVar15));
  local_460 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01a7b8e2:
  if (uVar63 == 0) {
LAB_01a7e24a:
    return uVar63 != 0;
  }
  lVar17 = 0;
  for (uVar57 = uVar63; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar17 = lVar17 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar1].ptr;
  uVar57 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar17 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar17 = *(long *)&pGVar2[1].time_range.upper;
  auVar70 = *(undefined1 (*) [16])(lVar17 + (long)p_Var3 * uVar57);
  auVar12 = *(undefined1 (*) [16])(lVar17 + (uVar57 + 1) * (long)p_Var3);
  auVar71 = *(undefined1 (*) [16])(lVar17 + (uVar57 + 2) * (long)p_Var3);
  local_688 = uVar63 - 1 & uVar63;
  auVar72 = *(undefined1 (*) [16])(lVar17 + (uVar57 + 3) * (long)p_Var3);
  if (local_688 != 0) {
    uVar60 = local_688 - 1 & local_688;
    for (uVar57 = local_688; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    }
    if (uVar60 != 0) {
      for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar73 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_500 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_520 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar68 = vunpcklps_avx512vl(local_500._0_16_,local_520._0_16_);
  _local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar75 = local_540._0_16_;
  local_770 = vinsertps_avx512f(auVar68,auVar75,0x28);
  auVar78._0_4_ = auVar70._0_4_ + auVar12._0_4_ + auVar71._0_4_ + auVar72._0_4_;
  auVar78._4_4_ = auVar70._4_4_ + auVar12._4_4_ + auVar71._4_4_ + auVar72._4_4_;
  auVar78._8_4_ = auVar70._8_4_ + auVar12._8_4_ + auVar71._8_4_ + auVar72._8_4_;
  auVar78._12_4_ = auVar70._12_4_ + auVar12._12_4_ + auVar71._12_4_ + auVar72._12_4_;
  auVar77._8_4_ = 0x3e800000;
  auVar77._0_8_ = 0x3e8000003e800000;
  auVar77._12_4_ = 0x3e800000;
  auVar68 = vmulps_avx512vl(auVar78,auVar77);
  auVar68 = vsubps_avx(auVar68,auVar73);
  auVar68 = vdpps_avx(auVar68,local_770,0x7f);
  fVar253 = *(float *)(ray + k * 4 + 0x60);
  local_780 = vdpps_avx(local_770,local_770,0x7f);
  auVar76._4_12_ = ZEXT812(0) << 0x20;
  auVar76._0_4_ = local_780._0_4_;
  auVar69 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar76);
  auVar74 = vfnmadd213ss_fma(auVar69,local_780,ZEXT416(0x40000000));
  local_240 = auVar68._0_4_ * auVar69._0_4_ * auVar74._0_4_;
  auVar233._4_4_ = local_240;
  auVar233._0_4_ = local_240;
  auVar233._8_4_ = local_240;
  auVar233._12_4_ = local_240;
  fStack_750 = local_240;
  _local_760 = auVar233;
  fStack_74c = local_240;
  fStack_748 = local_240;
  fStack_744 = local_240;
  auVar68 = vfmadd231ps_fma(auVar73,local_770,auVar233);
  auVar68 = vblendps_avx(auVar68,ZEXT816(0) << 0x40,8);
  auVar70 = vsubps_avx(auVar70,auVar68);
  auVar71 = vsubps_avx(auVar71,auVar68);
  auVar12 = vsubps_avx(auVar12,auVar68);
  auVar72 = vsubps_avx(auVar72,auVar68);
  local_7e0 = vbroadcastss_avx512vl(auVar70);
  auVar255 = ZEXT3264(local_7e0);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_620 = ZEXT1632(auVar70);
  local_800 = vpermps_avx2(auVar106,local_620);
  auVar249 = ZEXT3264(local_800);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  local_820 = vpermps_avx2(auVar107,local_620);
  auVar251 = ZEXT3264(local_820);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  local_840 = vpermps_avx2(auVar108,local_620);
  uVar153 = auVar12._0_4_;
  local_860._4_4_ = uVar153;
  local_860._0_4_ = uVar153;
  local_860._8_4_ = uVar153;
  local_860._12_4_ = uVar153;
  local_860._16_4_ = uVar153;
  local_860._20_4_ = uVar153;
  local_860._24_4_ = uVar153;
  local_860._28_4_ = uVar153;
  auVar238 = ZEXT3264(local_860);
  local_660 = ZEXT1632(auVar12);
  local_880 = vpermps_avx2(auVar106,local_660);
  local_8a0 = vpermps_avx2(auVar107,local_660);
  auVar254 = ZEXT3264(local_8a0);
  auVar86 = vpermps_avx512vl(auVar108,local_660);
  auVar244 = ZEXT3264(local_8a0);
  auVar84 = vbroadcastss_avx512vl(auVar71);
  local_640 = ZEXT1632(auVar71);
  auVar87 = vpermps_avx512vl(auVar106,local_640);
  auVar88 = vpermps_avx512vl(auVar107,local_640);
  auVar89 = vpermps_avx512vl(auVar108,local_640);
  auVar242 = ZEXT3264(local_880);
  fVar136 = auVar72._0_4_;
  _local_680 = ZEXT1632(auVar72);
  auVar85 = vpermps_avx512vl(auVar106,_local_680);
  auVar90 = vpermps_avx512vl(auVar107,_local_680);
  auVar91 = vpermps_avx512vl(auVar108,_local_680);
  auVar70 = vmulss_avx512f(auVar75,auVar75);
  auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),local_520,local_520);
  auVar92 = vfmadd231ps_avx512vl(auVar92,local_500,local_500);
  auVar92 = vbroadcastss_avx512vl(auVar92._0_16_);
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar92,auVar105);
  local_220 = auVar92;
  local_6f0 = ZEXT416((uint)local_240);
  local_240 = fVar253 - local_240;
  auVar246 = ZEXT3264(local_840);
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  local_400 = vpbroadcastd_avx512vl();
  uVar57 = 0;
  bVar56 = 0;
  local_adc = 1;
  local_420 = vpbroadcastd_avx512vl();
  auVar70 = vsqrtss_avx(local_780,local_780);
  auVar12 = vsqrtss_avx(local_780,local_780);
  local_470 = ZEXT816(0x3f80000000000000);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar257 = ZEXT3264(auVar93);
  auVar224 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar71 = vmovshdup_avx(local_470);
    auVar71 = vsubps_avx(auVar71,local_470);
    fVar171 = auVar71._0_4_;
    fVar137 = fVar171 * 0.04761905;
    auVar196._0_4_ = local_470._0_4_;
    auVar196._4_4_ = auVar196._0_4_;
    auVar196._8_4_ = auVar196._0_4_;
    auVar196._12_4_ = auVar196._0_4_;
    auVar196._16_4_ = auVar196._0_4_;
    auVar196._20_4_ = auVar196._0_4_;
    auVar196._24_4_ = auVar196._0_4_;
    auVar196._28_4_ = auVar196._0_4_;
    auVar79._4_4_ = fVar171;
    auVar79._0_4_ = fVar171;
    auVar79._8_4_ = fVar171;
    auVar79._12_4_ = fVar171;
    auVar212._16_4_ = fVar171;
    auVar212._0_16_ = auVar79;
    auVar212._20_4_ = fVar171;
    auVar212._24_4_ = fVar171;
    auVar212._28_4_ = fVar171;
    auVar71 = vfmadd231ps_fma(auVar196,auVar212,auVar224._0_32_);
    auVar256 = auVar257._0_32_;
    auVar93 = vsubps_avx512vl(auVar256,ZEXT1632(auVar71));
    fVar151 = auVar71._0_4_;
    fVar165 = auVar71._4_4_;
    auVar220._4_4_ = auVar238._4_4_ * fVar165;
    auVar220._0_4_ = auVar238._0_4_ * fVar151;
    fVar167 = auVar71._8_4_;
    auVar220._8_4_ = auVar238._8_4_ * fVar167;
    fVar169 = auVar71._12_4_;
    auVar220._12_4_ = auVar238._12_4_ * fVar169;
    auVar220._16_4_ = auVar238._16_4_ * 0.0;
    auVar220._20_4_ = auVar238._20_4_ * 0.0;
    auVar220._24_4_ = auVar238._24_4_ * 0.0;
    auVar220._28_4_ = auVar196._0_4_;
    auVar114._4_4_ = auVar242._4_4_ * fVar165;
    auVar114._0_4_ = auVar242._0_4_ * fVar151;
    auVar114._8_4_ = auVar242._8_4_ * fVar167;
    auVar114._12_4_ = auVar242._12_4_ * fVar169;
    auVar114._16_4_ = auVar242._16_4_ * 0.0;
    auVar114._20_4_ = auVar242._20_4_ * 0.0;
    auVar114._24_4_ = auVar242._24_4_ * 0.0;
    auVar114._28_4_ = fVar171;
    auVar225._0_4_ = auVar244._0_4_ * fVar151;
    auVar225._4_4_ = auVar244._4_4_ * fVar165;
    auVar225._8_4_ = auVar244._8_4_ * fVar167;
    auVar225._12_4_ = auVar244._12_4_ * fVar169;
    auVar225._16_4_ = auVar244._16_4_ * 0.0;
    auVar225._20_4_ = auVar244._20_4_ * 0.0;
    auVar225._28_36_ = auVar224._28_36_;
    auVar225._24_4_ = auVar244._24_4_ * 0.0;
    auVar94 = vmulps_avx512vl(auVar86,ZEXT1632(auVar71));
    auVar83 = vfmadd231ps_avx512vl(auVar220,auVar93,auVar255._0_32_);
    auVar72 = vfmadd231ps_fma(auVar114,auVar93,auVar249._0_32_);
    auVar68 = vfmadd231ps_fma(auVar225._0_32_,auVar93,auVar251._0_32_);
    auVar73 = vfmadd231ps_fma(auVar94,auVar93,auVar246._0_32_);
    auVar94 = vmulps_avx512vl(auVar84,ZEXT1632(auVar71));
    auVar97 = ZEXT1632(auVar71);
    auVar81 = vmulps_avx512vl(auVar87,auVar97);
    auVar82 = vmulps_avx512vl(auVar88,auVar97);
    auVar95 = vmulps_avx512vl(auVar89,auVar97);
    auVar74 = vfmadd231ps_fma(auVar94,auVar93,auVar238._0_32_);
    auVar69 = vfmadd231ps_fma(auVar81,auVar93,auVar242._0_32_);
    auVar75 = vfmadd231ps_fma(auVar82,auVar93,auVar244._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar86);
    auVar115._4_4_ = fVar136 * fVar165;
    auVar115._0_4_ = fVar136 * fVar151;
    auVar115._8_4_ = fVar136 * fVar167;
    auVar115._12_4_ = fVar136 * fVar169;
    auVar115._16_4_ = fVar136 * 0.0;
    auVar115._20_4_ = fVar136 * 0.0;
    auVar115._24_4_ = fVar136 * 0.0;
    auVar115._28_4_ = auVar238._28_4_;
    auVar81 = vmulps_avx512vl(auVar85,auVar97);
    auVar82 = vmulps_avx512vl(auVar90,auVar97);
    auVar95 = vmulps_avx512vl(auVar91,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar115,auVar93,auVar84);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar93,auVar87);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,auVar88);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar89);
    auVar238._28_36_ = auVar254._28_36_;
    auVar238._0_28_ =
         ZEXT1628(CONCAT412(fVar169 * auVar74._12_4_,
                            CONCAT48(fVar167 * auVar74._8_4_,
                                     CONCAT44(fVar165 * auVar74._4_4_,fVar151 * auVar74._0_4_))));
    auVar97 = vmulps_avx512vl(auVar97,ZEXT1632(auVar69));
    auVar98 = vmulps_avx512vl(ZEXT1632(auVar71),ZEXT1632(auVar75));
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar71),auVar94);
    auVar71 = vfmadd231ps_fma(auVar238._0_32_,auVar93,auVar83);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar72));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar68));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar73));
    auVar236._0_4_ = auVar96._0_4_ * fVar151;
    auVar236._4_4_ = auVar96._4_4_ * fVar165;
    auVar236._8_4_ = auVar96._8_4_ * fVar167;
    auVar236._12_4_ = auVar96._12_4_ * fVar169;
    auVar236._16_4_ = auVar96._16_4_ * 0.0;
    auVar236._20_4_ = auVar96._20_4_ * 0.0;
    auVar236._24_4_ = auVar96._24_4_ * 0.0;
    auVar236._28_4_ = 0;
    auVar118._4_4_ = auVar81._4_4_ * fVar165;
    auVar118._0_4_ = auVar81._0_4_ * fVar151;
    auVar118._8_4_ = auVar81._8_4_ * fVar167;
    auVar118._12_4_ = auVar81._12_4_ * fVar169;
    auVar118._16_4_ = auVar81._16_4_ * 0.0;
    auVar118._20_4_ = auVar81._20_4_ * 0.0;
    auVar118._24_4_ = auVar81._24_4_ * 0.0;
    auVar118._28_4_ = auVar96._28_4_;
    auVar119._4_4_ = auVar82._4_4_ * fVar165;
    auVar119._0_4_ = auVar82._0_4_ * fVar151;
    auVar119._8_4_ = auVar82._8_4_ * fVar167;
    auVar119._12_4_ = auVar82._12_4_ * fVar169;
    auVar119._16_4_ = auVar82._16_4_ * 0.0;
    auVar119._20_4_ = auVar82._20_4_ * 0.0;
    auVar119._24_4_ = auVar82._24_4_ * 0.0;
    auVar119._28_4_ = auVar81._28_4_;
    auVar34._4_4_ = auVar95._4_4_ * fVar165;
    auVar34._0_4_ = auVar95._0_4_ * fVar151;
    auVar34._8_4_ = auVar95._8_4_ * fVar167;
    auVar34._12_4_ = auVar95._12_4_ * fVar169;
    auVar34._16_4_ = auVar95._16_4_ * 0.0;
    auVar34._20_4_ = auVar95._20_4_ * 0.0;
    auVar34._24_4_ = auVar95._24_4_ * 0.0;
    auVar34._28_4_ = auVar82._28_4_;
    auVar72 = vfmadd231ps_fma(auVar236,auVar93,ZEXT1632(auVar74));
    auVar68 = vfmadd231ps_fma(auVar118,auVar93,ZEXT1632(auVar69));
    auVar73 = vfmadd231ps_fma(auVar119,auVar93,ZEXT1632(auVar75));
    auVar74 = vfmadd231ps_fma(auVar34,auVar93,auVar94);
    auVar35._28_4_ = auVar83._28_4_;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(auVar73._12_4_ * fVar169,
                            CONCAT48(auVar73._8_4_ * fVar167,
                                     CONCAT44(auVar73._4_4_ * fVar165,auVar73._0_4_ * fVar151))));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar169 * auVar72._12_4_,
                                                 CONCAT48(fVar167 * auVar72._8_4_,
                                                          CONCAT44(fVar165 * auVar72._4_4_,
                                                                   fVar151 * auVar72._0_4_)))),
                              auVar93,ZEXT1632(auVar71));
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar68._12_4_ * fVar169,
                                            CONCAT48(auVar68._8_4_ * fVar167,
                                                     CONCAT44(auVar68._4_4_ * fVar165,
                                                              auVar68._0_4_ * fVar151)))),auVar93,
                         auVar97);
    auVar100 = vfmadd231ps_avx512vl(auVar35,auVar93,auVar98);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar74._12_4_ * fVar169,
                                            CONCAT48(auVar74._8_4_ * fVar167,
                                                     CONCAT44(auVar74._4_4_ * fVar165,
                                                              auVar74._0_4_ * fVar151)))),auVar99,
                         auVar93);
    auVar93 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar71));
    auVar83 = vsubps_avx512vl(ZEXT1632(auVar68),auVar97);
    auVar81 = vsubps_avx512vl(ZEXT1632(auVar73),auVar98);
    auVar82 = vsubps_avx512vl(ZEXT1632(auVar74),auVar99);
    auVar247._0_4_ = fVar137 * auVar93._0_4_ * 3.0;
    auVar247._4_4_ = fVar137 * auVar93._4_4_ * 3.0;
    auVar247._8_4_ = fVar137 * auVar93._8_4_ * 3.0;
    auVar247._12_4_ = fVar137 * auVar93._12_4_ * 3.0;
    auVar247._16_4_ = fVar137 * auVar93._16_4_ * 3.0;
    auVar247._20_4_ = fVar137 * auVar93._20_4_ * 3.0;
    auVar247._24_4_ = fVar137 * auVar93._24_4_ * 3.0;
    auVar247._28_4_ = 0;
    auVar250._0_4_ = fVar137 * auVar83._0_4_ * 3.0;
    auVar250._4_4_ = fVar137 * auVar83._4_4_ * 3.0;
    auVar250._8_4_ = fVar137 * auVar83._8_4_ * 3.0;
    auVar250._12_4_ = fVar137 * auVar83._12_4_ * 3.0;
    auVar250._16_4_ = fVar137 * auVar83._16_4_ * 3.0;
    auVar250._20_4_ = fVar137 * auVar83._20_4_ * 3.0;
    auVar250._24_4_ = fVar137 * auVar83._24_4_ * 3.0;
    auVar250._28_4_ = 0;
    auVar36._4_4_ = fVar137 * auVar81._4_4_ * 3.0;
    auVar36._0_4_ = fVar137 * auVar81._0_4_ * 3.0;
    auVar36._8_4_ = fVar137 * auVar81._8_4_ * 3.0;
    auVar36._12_4_ = fVar137 * auVar81._12_4_ * 3.0;
    auVar36._16_4_ = fVar137 * auVar81._16_4_ * 3.0;
    auVar36._20_4_ = fVar137 * auVar81._20_4_ * 3.0;
    auVar36._24_4_ = fVar137 * auVar81._24_4_ * 3.0;
    auVar36._28_4_ = auVar95._28_4_;
    fVar151 = auVar82._0_4_ * 3.0 * fVar137;
    fVar165 = auVar82._4_4_ * 3.0 * fVar137;
    auVar37._4_4_ = fVar165;
    auVar37._0_4_ = fVar151;
    fVar167 = auVar82._8_4_ * 3.0 * fVar137;
    auVar37._8_4_ = fVar167;
    fVar169 = auVar82._12_4_ * 3.0 * fVar137;
    auVar37._12_4_ = fVar169;
    fVar171 = auVar82._16_4_ * 3.0 * fVar137;
    auVar37._16_4_ = fVar171;
    fVar200 = auVar82._20_4_ * 3.0 * fVar137;
    auVar37._20_4_ = fVar200;
    fVar174 = auVar82._24_4_ * 3.0 * fVar137;
    auVar37._24_4_ = fVar174;
    auVar37._28_4_ = fVar137;
    auVar71 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar71);
    auVar95 = vpermt2ps_avx512vl(ZEXT1632(auVar69),_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar97 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar83 = ZEXT1632(auVar71);
    auVar98 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar83);
    auVar230._0_4_ = auVar94._0_4_ + fVar151;
    auVar230._4_4_ = auVar94._4_4_ + fVar165;
    auVar230._8_4_ = auVar94._8_4_ + fVar167;
    auVar230._12_4_ = auVar94._12_4_ + fVar169;
    auVar230._16_4_ = auVar94._16_4_ + fVar171;
    auVar230._20_4_ = auVar94._20_4_ + fVar200;
    auVar230._24_4_ = auVar94._24_4_ + fVar174;
    auVar230._28_4_ = auVar94._28_4_ + fVar137;
    auVar93 = vmaxps_avx(auVar94,auVar230);
    auVar99 = vminps_avx512vl(auVar94,auVar230);
    auVar101 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,auVar83);
    auVar102 = vpermt2ps_avx512vl(auVar247,_DAT_01fb9fc0,auVar83);
    auVar103 = vpermt2ps_avx512vl(auVar250,_DAT_01fb9fc0,auVar83);
    auVar114 = ZEXT1632(auVar71);
    auVar104 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9fc0,auVar114);
    auVar94 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar114);
    auVar94 = vsubps_avx(auVar101,auVar94);
    auVar83 = vsubps_avx(auVar95,ZEXT1632(auVar69));
    auVar81 = vsubps_avx(auVar97,auVar96);
    auVar82 = vsubps_avx(auVar98,auVar100);
    auVar105 = vmulps_avx512vl(auVar81,auVar36);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar250,auVar82);
    auVar106 = vmulps_avx512vl(auVar82,auVar247);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar36,auVar83);
    auVar107 = vmulps_avx512vl(auVar83,auVar250);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar247,auVar81);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar82,auVar82);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar81,auVar81);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar83,auVar83);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar256);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar107);
    auVar108 = vmulps_avx512vl(auVar81,auVar104);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar103,auVar82);
    auVar109 = vmulps_avx512vl(auVar82,auVar102);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar104,auVar83);
    auVar110 = vmulps_avx512vl(auVar83,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar102,auVar81);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar105 = vmaxps_avx512vl(auVar105,auVar107);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar107 = vmaxps_avx512vl(auVar94,auVar101);
    auVar93 = vmaxps_avx512vl(auVar93,auVar107);
    auVar107 = vaddps_avx512vl(auVar105,auVar93);
    auVar93 = vminps_avx(auVar94,auVar101);
    auVar93 = vminps_avx512vl(auVar99,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar105);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar107,auVar109);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    auVar93 = vmulps_avx512vl(auVar93,auVar110);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar99 = vrsqrt14ps_avx512vl(auVar106);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar106,auVar111);
    fVar151 = auVar99._0_4_;
    fVar165 = auVar99._4_4_;
    fVar167 = auVar99._8_4_;
    fVar169 = auVar99._12_4_;
    fVar137 = auVar99._16_4_;
    fVar171 = auVar99._20_4_;
    fVar200 = auVar99._24_4_;
    auVar38._4_4_ = fVar165 * fVar165 * fVar165 * auVar101._4_4_;
    auVar38._0_4_ = fVar151 * fVar151 * fVar151 * auVar101._0_4_;
    auVar38._8_4_ = fVar167 * fVar167 * fVar167 * auVar101._8_4_;
    auVar38._12_4_ = fVar169 * fVar169 * fVar169 * auVar101._12_4_;
    auVar38._16_4_ = fVar137 * fVar137 * fVar137 * auVar101._16_4_;
    auVar38._20_4_ = fVar171 * fVar171 * fVar171 * auVar101._20_4_;
    auVar38._24_4_ = fVar200 * fVar200 * fVar200 * auVar101._24_4_;
    auVar38._28_4_ = auVar107._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar38,auVar99,auVar112);
    auVar254 = ZEXT3264(auVar99);
    auVar101 = vmulps_avx512vl(auVar83,auVar99);
    auVar105 = vmulps_avx512vl(auVar81,auVar99);
    auVar106 = vmulps_avx512vl(auVar82,auVar99);
    auVar220 = ZEXT1632(auVar69);
    auVar107 = vsubps_avx512vl(auVar114,auVar220);
    auVar108 = vsubps_avx512vl(auVar114,auVar96);
    auVar109 = vsubps_avx512vl(auVar114,auVar100);
    auVar110 = vmulps_avx512vl(_local_540,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_520,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_500,auVar107);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar112 = vmulps_avx512vl(_local_540,auVar106);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar105,local_520);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,local_500);
    auVar106 = vmulps_avx512vl(auVar109,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar101);
    auVar105 = vmulps_avx512vl(auVar112,auVar112);
    auVar106 = vsubps_avx512vl(auVar92,auVar105);
    auVar113 = vmulps_avx512vl(auVar112,auVar101);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar110 = vaddps_avx512vl(auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar101,auVar101);
    local_7c0 = vsubps_avx512vl(auVar111,auVar113);
    auVar94 = vsubps_avx512vl(local_7c0,auVar94);
    local_560 = vmulps_avx512vl(auVar110,auVar110);
    auVar113._8_4_ = 0x40800000;
    auVar113._0_8_ = 0x4080000040800000;
    auVar113._12_4_ = 0x40800000;
    auVar113._16_4_ = 0x40800000;
    auVar113._20_4_ = 0x40800000;
    auVar113._24_4_ = 0x40800000;
    auVar113._28_4_ = 0x40800000;
    _local_580 = vmulps_avx512vl(auVar106,auVar113);
    auVar111 = vmulps_avx512vl(_local_580,auVar94);
    auVar111 = vsubps_avx512vl(local_560,auVar111);
    uVar60 = vcmpps_avx512vl(auVar111,auVar114,5);
    bVar53 = (byte)uVar60;
    fVar151 = (float)local_760._0_4_;
    fVar165 = (float)local_760._4_4_;
    fVar167 = fStack_758;
    fVar169 = fStack_754;
    fVar137 = fStack_750;
    fVar171 = fStack_74c;
    fVar200 = fStack_748;
    fVar174 = fStack_744;
    if (bVar53 == 0) {
LAB_01a7c650:
      auVar224 = ZEXT3264(_DAT_01f7b040);
      auVar255 = ZEXT3264(local_7e0);
      auVar249 = ZEXT3264(local_800);
      auVar251 = ZEXT3264(local_820);
      auVar246 = ZEXT3264(local_840);
      auVar238 = ZEXT3264(local_860);
      auVar242 = ZEXT3264(local_880);
      auVar244 = ZEXT3264(local_8a0);
    }
    else {
      auVar111 = vsqrtps_avx512vl(auVar111);
      auVar113 = vaddps_avx512vl(auVar106,auVar106);
      local_600 = vrcp14ps_avx512vl(auVar113);
      in_ZMM31 = ZEXT3264(local_600);
      auVar114 = vfnmadd213ps_avx512vl(local_600,auVar113,auVar256);
      auVar114 = vfmadd132ps_avx512vl(auVar114,local_600,local_600);
      auVar256._8_4_ = 0x80000000;
      auVar256._0_8_ = 0x8000000080000000;
      auVar256._12_4_ = 0x80000000;
      auVar256._16_4_ = 0x80000000;
      auVar256._20_4_ = 0x80000000;
      auVar256._24_4_ = 0x80000000;
      auVar256._28_4_ = 0x80000000;
      local_5a0 = vxorps_avx512vl(auVar110,auVar256);
      auVar115 = vsubps_avx512vl(local_5a0,auVar111);
      local_740 = vmulps_avx512vl(auVar115,auVar114);
      auVar111 = vsubps_avx512vl(auVar111,auVar110);
      local_7a0 = vmulps_avx512vl(auVar111,auVar114);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar111,local_740);
      auVar116._0_4_ =
           (uint)(bVar53 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar111._0_4_;
      bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar64 * auVar114._4_4_ | (uint)!bVar64 * auVar111._4_4_;
      bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar64 * auVar114._8_4_ | (uint)!bVar64 * auVar111._8_4_;
      bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar64 * auVar114._12_4_ | (uint)!bVar64 * auVar111._12_4_;
      bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar64 * auVar114._16_4_ | (uint)!bVar64 * auVar111._16_4_;
      bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar64 * auVar114._20_4_ | (uint)!bVar64 * auVar111._20_4_;
      bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar64 * auVar114._24_4_ | (uint)!bVar64 * auVar111._24_4_;
      bVar64 = SUB81(uVar60 >> 7,0);
      auVar116._28_4_ = (uint)bVar64 * auVar114._28_4_ | (uint)!bVar64 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar111,local_7a0);
      auVar117._0_4_ =
           (uint)(bVar53 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar111._0_4_;
      bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar64 * auVar114._4_4_ | (uint)!bVar64 * auVar111._4_4_;
      bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar64 * auVar114._8_4_ | (uint)!bVar64 * auVar111._8_4_;
      bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar64 * auVar114._12_4_ | (uint)!bVar64 * auVar111._12_4_;
      bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar64 * auVar114._16_4_ | (uint)!bVar64 * auVar111._16_4_;
      bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar64 * auVar114._20_4_ | (uint)!bVar64 * auVar111._20_4_;
      bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar64 * auVar114._24_4_ | (uint)!bVar64 * auVar111._24_4_;
      bVar64 = SUB81(uVar60 >> 7,0);
      auVar117._28_4_ = (uint)bVar64 * auVar114._28_4_ | (uint)!bVar64 * auVar111._28_4_;
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar111);
      local_5c0 = vmaxps_avx512vl(local_220,auVar111);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      local_5e0 = vmulps_avx512vl(local_5c0,auVar28);
      vandps_avx512vl(auVar106,auVar111);
      uVar62 = vcmpps_avx512vl(local_5e0,local_5e0,1);
      uVar60 = uVar60 & uVar62;
      bVar59 = (byte)uVar60;
      if (bVar59 != 0) {
        uVar62 = vcmpps_avx512vl(auVar94,_DAT_01f7b000,2);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar94,auVar105);
        bVar58 = (byte)uVar62;
        uVar67 = (uint)(bVar58 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar58 & 1) * local_5e0._0_4_;
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        uVar129 = (uint)bVar64 * auVar106._4_4_ | (uint)!bVar64 * local_5e0._4_4_;
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        uVar130 = (uint)bVar64 * auVar106._8_4_ | (uint)!bVar64 * local_5e0._8_4_;
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        uVar131 = (uint)bVar64 * auVar106._12_4_ | (uint)!bVar64 * local_5e0._12_4_;
        bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
        uVar132 = (uint)bVar64 * auVar106._16_4_ | (uint)!bVar64 * local_5e0._16_4_;
        bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
        uVar133 = (uint)bVar64 * auVar106._20_4_ | (uint)!bVar64 * local_5e0._20_4_;
        bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
        uVar134 = (uint)bVar64 * auVar106._24_4_ | (uint)!bVar64 * local_5e0._24_4_;
        bVar64 = SUB81(uVar62 >> 7,0);
        uVar135 = (uint)bVar64 * auVar106._28_4_ | (uint)!bVar64 * local_5e0._28_4_;
        auVar116._0_4_ = (bVar59 & 1) * uVar67 | !(bool)(bVar59 & 1) * auVar116._0_4_;
        bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar116._4_4_ = bVar64 * uVar129 | !bVar64 * auVar116._4_4_;
        bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar116._8_4_ = bVar64 * uVar130 | !bVar64 * auVar116._8_4_;
        bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar116._12_4_ = bVar64 * uVar131 | !bVar64 * auVar116._12_4_;
        bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar116._16_4_ = bVar64 * uVar132 | !bVar64 * auVar116._16_4_;
        bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar116._20_4_ = bVar64 * uVar133 | !bVar64 * auVar116._20_4_;
        bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar116._24_4_ = bVar64 * uVar134 | !bVar64 * auVar116._24_4_;
        bVar64 = SUB81(uVar60 >> 7,0);
        auVar116._28_4_ = bVar64 * uVar135 | !bVar64 * auVar116._28_4_;
        auVar94 = vblendmps_avx512vl(auVar105,auVar94);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar10 = SUB81(uVar62 >> 7,0);
        auVar117._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar58 & 1) * auVar94._0_4_ | !(bool)(bVar58 & 1) * uVar67) |
             !(bool)(bVar59 & 1) * auVar117._0_4_;
        bVar4 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar117._4_4_ =
             (uint)bVar4 * ((uint)bVar64 * auVar94._4_4_ | !bVar64 * uVar129) |
             !bVar4 * auVar117._4_4_;
        bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar117._8_4_ =
             (uint)bVar64 * ((uint)bVar5 * auVar94._8_4_ | !bVar5 * uVar130) |
             !bVar64 * auVar117._8_4_;
        bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar117._12_4_ =
             (uint)bVar64 * ((uint)bVar6 * auVar94._12_4_ | !bVar6 * uVar131) |
             !bVar64 * auVar117._12_4_;
        bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar117._16_4_ =
             (uint)bVar64 * ((uint)bVar7 * auVar94._16_4_ | !bVar7 * uVar132) |
             !bVar64 * auVar117._16_4_;
        bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar117._20_4_ =
             (uint)bVar64 * ((uint)bVar8 * auVar94._20_4_ | !bVar8 * uVar133) |
             !bVar64 * auVar117._20_4_;
        bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar117._24_4_ =
             (uint)bVar64 * ((uint)bVar9 * auVar94._24_4_ | !bVar9 * uVar134) |
             !bVar64 * auVar117._24_4_;
        bVar64 = SUB81(uVar60 >> 7,0);
        auVar117._28_4_ =
             (uint)bVar64 * ((uint)bVar10 * auVar94._28_4_ | !bVar10 * uVar135) |
             !bVar64 * auVar117._28_4_;
        bVar53 = (~bVar59 | bVar58) & bVar53;
      }
      if ((bVar53 & 0x7f) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar257 = ZEXT3264(auVar93);
        auVar224 = ZEXT3264(_DAT_01f7b040);
        auVar255 = ZEXT3264(local_7e0);
        auVar249 = ZEXT3264(local_800);
        auVar251 = ZEXT3264(local_820);
        auVar246 = ZEXT3264(local_840);
        auVar238 = ZEXT3264(local_860);
        auVar242 = ZEXT3264(local_880);
        auVar244 = ZEXT3264(local_8a0);
      }
      else {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar104 = vxorps_avx512vl(auVar104,auVar94);
        auVar102 = vxorps_avx512vl(auVar102,auVar94);
        auVar224 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar103 = vxorps_avx512vl(auVar103,auVar94);
        auVar71 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_6f0._0_4_));
        auVar105 = vbroadcastss_avx512vl(auVar71);
        auVar105 = vminps_avx512vl(auVar105,auVar117);
        auVar52._4_4_ = fStack_23c;
        auVar52._0_4_ = local_240;
        auVar52._8_4_ = fStack_238;
        auVar52._12_4_ = fStack_234;
        auVar52._16_4_ = fStack_230;
        auVar52._20_4_ = fStack_22c;
        auVar52._24_4_ = fStack_228;
        auVar52._28_4_ = fStack_224;
        auVar106 = vmaxps_avx512vl(auVar52,auVar116);
        auVar109 = vmulps_avx512vl(auVar109,auVar36);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar250,auVar109);
        auVar71 = vfmadd213ps_fma(auVar107,auVar247,auVar108);
        in_ZMM31 = ZEXT3264(_local_540);
        auVar107 = vmulps_avx512vl(_local_540,auVar36);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_520,auVar250);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_500,auVar247);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar107,auVar108);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar13 = vcmpps_avx512vl(auVar108,auVar109,1);
        auVar111 = vxorps_avx512vl(ZEXT1632(auVar71),auVar94);
        auVar114 = vrcp14ps_avx512vl(auVar107);
        auVar115 = vxorps_avx512vl(auVar107,auVar94);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar119 = vfnmadd213ps_avx512vl(auVar114,auVar107,auVar118);
        auVar71 = vfmadd132ps_fma(auVar119,auVar114,auVar114);
        fVar152 = auVar71._0_4_ * auVar111._0_4_;
        fVar166 = auVar71._4_4_ * auVar111._4_4_;
        auVar39._4_4_ = fVar166;
        auVar39._0_4_ = fVar152;
        fVar168 = auVar71._8_4_ * auVar111._8_4_;
        auVar39._8_4_ = fVar168;
        fVar170 = auVar71._12_4_ * auVar111._12_4_;
        auVar39._12_4_ = fVar170;
        fVar172 = auVar111._16_4_ * 0.0;
        auVar39._16_4_ = fVar172;
        fVar173 = auVar111._20_4_ * 0.0;
        auVar39._20_4_ = fVar173;
        fVar175 = auVar111._24_4_ * 0.0;
        auVar39._24_4_ = fVar175;
        auVar39._28_4_ = auVar111._28_4_;
        uVar15 = vcmpps_avx512vl(auVar107,auVar115,1);
        bVar59 = (byte)uVar13 | (byte)uVar15;
        auVar252._8_4_ = 0xff800000;
        auVar252._0_8_ = 0xff800000ff800000;
        auVar252._12_4_ = 0xff800000;
        auVar252._16_4_ = 0xff800000;
        auVar252._20_4_ = 0xff800000;
        auVar252._24_4_ = 0xff800000;
        auVar252._28_4_ = 0xff800000;
        auVar119 = vblendmps_avx512vl(auVar39,auVar252);
        auVar120._0_4_ =
             (uint)(bVar59 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar114._0_4_;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar64 * auVar119._4_4_ | (uint)!bVar64 * auVar114._4_4_;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar64 * auVar119._8_4_ | (uint)!bVar64 * auVar114._8_4_;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar64 * auVar119._12_4_ | (uint)!bVar64 * auVar114._12_4_;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar64 * auVar119._16_4_ | (uint)!bVar64 * auVar114._16_4_;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar64 * auVar119._20_4_ | (uint)!bVar64 * auVar114._20_4_;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar64 * auVar119._24_4_ | (uint)!bVar64 * auVar114._24_4_;
        auVar120._28_4_ =
             (uint)(bVar59 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar114._28_4_;
        auVar106 = vmaxps_avx512vl(auVar106,auVar120);
        uVar15 = vcmpps_avx512vl(auVar107,auVar115,6);
        bVar59 = (byte)uVar13 | (byte)uVar15;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar121._0_4_ =
             (uint)(bVar59 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)fVar152;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar64 * auVar107._4_4_ | (uint)!bVar64 * (int)fVar166;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar64 * auVar107._8_4_ | (uint)!bVar64 * (int)fVar168;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar64 * auVar107._12_4_ | (uint)!bVar64 * (int)fVar170;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar64 * auVar107._16_4_ | (uint)!bVar64 * (int)fVar172;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar64 * auVar107._20_4_ | (uint)!bVar64 * (int)fVar173;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar64 * auVar107._24_4_ | (uint)!bVar64 * (int)fVar175;
        auVar121._28_4_ =
             (uint)(bVar59 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar111._28_4_;
        auVar111 = vminps_avx512vl(auVar105,auVar121);
        auVar72 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar72),auVar95);
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar72),auVar97);
        auVar98 = vsubps_avx512vl(ZEXT1632(auVar72),auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar104);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar97);
        auVar95 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar95);
        auVar97 = vmulps_avx512vl(_local_540,auVar104);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_520,auVar103);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_500,auVar102);
        vandps_avx512vl(auVar97,auVar108);
        uVar13 = vcmpps_avx512vl(auVar97,auVar109,1);
        auVar95 = vxorps_avx512vl(auVar95,auVar94);
        auVar98 = vrcp14ps_avx512vl(auVar97);
        auVar94 = vxorps_avx512vl(auVar97,auVar94);
        auVar102 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar118);
        auVar71 = vfmadd132ps_fma(auVar102,auVar98,auVar98);
        fVar152 = auVar71._0_4_ * auVar95._0_4_;
        fVar166 = auVar71._4_4_ * auVar95._4_4_;
        auVar40._4_4_ = fVar166;
        auVar40._0_4_ = fVar152;
        fVar168 = auVar71._8_4_ * auVar95._8_4_;
        auVar40._8_4_ = fVar168;
        fVar170 = auVar71._12_4_ * auVar95._12_4_;
        auVar40._12_4_ = fVar170;
        fVar172 = auVar95._16_4_ * 0.0;
        auVar40._16_4_ = fVar172;
        fVar173 = auVar95._20_4_ * 0.0;
        auVar40._20_4_ = fVar173;
        fVar175 = auVar95._24_4_ * 0.0;
        auVar40._24_4_ = fVar175;
        auVar40._28_4_ = auVar95._28_4_;
        uVar15 = vcmpps_avx512vl(auVar97,auVar94,1);
        bVar59 = (byte)uVar13 | (byte)uVar15;
        auVar102 = vblendmps_avx512vl(auVar40,auVar252);
        auVar122._0_4_ =
             (uint)(bVar59 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar98._0_4_;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar64 * auVar102._4_4_ | (uint)!bVar64 * auVar98._4_4_;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar64 * auVar102._8_4_ | (uint)!bVar64 * auVar98._8_4_;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar64 * auVar102._12_4_ | (uint)!bVar64 * auVar98._12_4_;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar64 * auVar102._16_4_ | (uint)!bVar64 * auVar98._16_4_;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar64 * auVar102._20_4_ | (uint)!bVar64 * auVar98._20_4_;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar64 * auVar102._24_4_ | (uint)!bVar64 * auVar98._24_4_;
        auVar122._28_4_ =
             (uint)(bVar59 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar98._28_4_;
        local_4e0 = vmaxps_avx(auVar106,auVar122);
        uVar15 = vcmpps_avx512vl(auVar97,auVar94,6);
        bVar59 = (byte)uVar13 | (byte)uVar15;
        auVar123._0_4_ =
             (uint)(bVar59 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)fVar152;
        bVar64 = (bool)(bVar59 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar64 * auVar107._4_4_ | (uint)!bVar64 * (int)fVar166;
        bVar64 = (bool)(bVar59 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar64 * auVar107._8_4_ | (uint)!bVar64 * (int)fVar168;
        bVar64 = (bool)(bVar59 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar64 * auVar107._12_4_ | (uint)!bVar64 * (int)fVar170;
        bVar64 = (bool)(bVar59 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar64 * auVar107._16_4_ | (uint)!bVar64 * (int)fVar172;
        bVar64 = (bool)(bVar59 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar64 * auVar107._20_4_ | (uint)!bVar64 * (int)fVar173;
        bVar64 = (bool)(bVar59 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar64 * auVar107._24_4_ | (uint)!bVar64 * (int)fVar175;
        auVar123._28_4_ =
             (uint)(bVar59 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar95._28_4_;
        local_2a0 = vminps_avx(auVar111,auVar123);
        uVar13 = vcmpps_avx512vl(local_4e0,local_2a0,2);
        bVar53 = bVar53 & 0x7f & (byte)uVar13;
        if (bVar53 == 0) {
          auVar257 = ZEXT3264(auVar118);
          goto LAB_01a7c650;
        }
        auVar94 = vmaxps_avx512vl(ZEXT1632(auVar72),auVar93);
        auVar93 = vfmadd213ps_avx512vl(local_740,auVar112,auVar101);
        fVar152 = auVar99._0_4_;
        fVar166 = auVar99._4_4_;
        auVar41._4_4_ = fVar166 * auVar93._4_4_;
        auVar41._0_4_ = fVar152 * auVar93._0_4_;
        fVar168 = auVar99._8_4_;
        auVar41._8_4_ = fVar168 * auVar93._8_4_;
        fVar170 = auVar99._12_4_;
        auVar41._12_4_ = fVar170 * auVar93._12_4_;
        fVar172 = auVar99._16_4_;
        auVar41._16_4_ = fVar172 * auVar93._16_4_;
        fVar173 = auVar99._20_4_;
        auVar41._20_4_ = fVar173 * auVar93._20_4_;
        fVar175 = auVar99._24_4_;
        auVar41._24_4_ = fVar175 * auVar93._24_4_;
        auVar41._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd213ps_avx512vl(local_7a0,auVar112,auVar101);
        auVar42._4_4_ = fVar166 * auVar93._4_4_;
        auVar42._0_4_ = fVar152 * auVar93._0_4_;
        auVar42._8_4_ = fVar168 * auVar93._8_4_;
        auVar42._12_4_ = fVar170 * auVar93._12_4_;
        auVar42._16_4_ = fVar172 * auVar93._16_4_;
        auVar42._20_4_ = fVar173 * auVar93._20_4_;
        auVar42._24_4_ = fVar175 * auVar93._24_4_;
        auVar42._28_4_ = auVar93._28_4_;
        auVar93 = vminps_avx512vl(auVar41,auVar118);
        auVar49 = ZEXT812(0);
        auVar95 = ZEXT1232(auVar49) << 0x20;
        auVar93 = vmaxps_avx(auVar93,ZEXT1232(auVar49) << 0x20);
        auVar97 = vminps_avx512vl(auVar42,auVar118);
        auVar43._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar93._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar43,auVar212,auVar196);
        auVar93 = vmaxps_avx(auVar97,ZEXT1232(auVar49) << 0x20);
        auVar44._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar93._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar44,auVar212,auVar196);
        auVar45._4_4_ = auVar94._4_4_ * auVar94._4_4_;
        auVar45._0_4_ = auVar94._0_4_ * auVar94._0_4_;
        auVar45._8_4_ = auVar94._8_4_ * auVar94._8_4_;
        auVar45._12_4_ = auVar94._12_4_ * auVar94._12_4_;
        auVar45._16_4_ = auVar94._16_4_ * auVar94._16_4_;
        auVar45._20_4_ = auVar94._20_4_ * auVar94._20_4_;
        auVar45._24_4_ = auVar94._24_4_ * auVar94._24_4_;
        auVar45._28_4_ = auVar94._28_4_;
        auVar93 = vsubps_avx(local_7c0,auVar45);
        auVar46._4_4_ = auVar93._4_4_ * (float)local_580._4_4_;
        auVar46._0_4_ = auVar93._0_4_ * (float)local_580._0_4_;
        auVar46._8_4_ = auVar93._8_4_ * fStack_578;
        auVar46._12_4_ = auVar93._12_4_ * fStack_574;
        auVar46._16_4_ = auVar93._16_4_ * fStack_570;
        auVar46._20_4_ = auVar93._20_4_ * fStack_56c;
        auVar46._24_4_ = auVar93._24_4_ * fStack_568;
        auVar46._28_4_ = auVar94._28_4_;
        auVar94 = vsubps_avx(local_560,auVar46);
        uVar13 = vcmpps_avx512vl(auVar94,ZEXT1232(auVar49) << 0x20,5);
        bVar59 = (byte)uVar13;
        if (bVar59 == 0) {
          bVar59 = 0;
          auVar83 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar238 = ZEXT864(0) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar245 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar125._8_4_ = 0xff800000;
          auVar125._0_8_ = 0xff800000ff800000;
          auVar125._12_4_ = 0xff800000;
          auVar125._16_4_ = 0xff800000;
          auVar125._20_4_ = 0xff800000;
          auVar125._24_4_ = 0xff800000;
          auVar125._28_4_ = 0xff800000;
        }
        else {
          auVar72 = vxorps_avx512vl(auVar79,auVar79);
          uVar60 = vcmpps_avx512vl(auVar94,ZEXT832(0) << 0x20,5);
          auVar94 = vsqrtps_avx(auVar94);
          auVar95 = vfnmadd213ps_avx512vl(auVar113,local_600,auVar118);
          auVar98 = vfmadd132ps_avx512vl(auVar95,local_600,local_600);
          auVar95 = vsubps_avx(local_5a0,auVar94);
          auVar102 = vmulps_avx512vl(auVar95,auVar98);
          auVar94 = vsubps_avx512vl(auVar94,auVar110);
          auVar98 = vmulps_avx512vl(auVar94,auVar98);
          auVar94 = vfmadd213ps_avx512vl(auVar112,auVar102,auVar101);
          auVar47._4_4_ = fVar166 * auVar94._4_4_;
          auVar47._0_4_ = fVar152 * auVar94._0_4_;
          auVar47._8_4_ = fVar168 * auVar94._8_4_;
          auVar47._12_4_ = fVar170 * auVar94._12_4_;
          auVar47._16_4_ = fVar172 * auVar94._16_4_;
          auVar47._20_4_ = fVar173 * auVar94._20_4_;
          auVar47._24_4_ = fVar175 * auVar94._24_4_;
          auVar47._28_4_ = auVar97._28_4_;
          auVar94 = vmulps_avx512vl(local_500,auVar102);
          auVar95 = vmulps_avx512vl(local_520,auVar102);
          auVar103 = vmulps_avx512vl(_local_540,auVar102);
          auVar97 = vfmadd213ps_avx512vl(auVar83,auVar47,auVar220);
          auVar94 = vsubps_avx512vl(auVar94,auVar97);
          auVar97 = vfmadd213ps_avx512vl(auVar81,auVar47,auVar96);
          auVar97 = vsubps_avx512vl(auVar95,auVar97);
          auVar71 = vfmadd213ps_fma(auVar47,auVar82,auVar100);
          auVar95 = vsubps_avx(auVar103,ZEXT1632(auVar71));
          auVar245 = auVar95._0_28_;
          auVar95 = vfmadd213ps_avx512vl(auVar112,auVar98,auVar101);
          auVar99 = vmulps_avx512vl(auVar99,auVar95);
          auVar254 = ZEXT3264(auVar99);
          auVar95 = vmulps_avx512vl(local_500,auVar98);
          auVar101 = vmulps_avx512vl(local_520,auVar98);
          auVar103 = vmulps_avx512vl(_local_540,auVar98);
          auVar71 = vfmadd213ps_fma(auVar83,auVar99,auVar220);
          auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar81,auVar99,auVar96);
          auVar83 = vsubps_avx512vl(auVar101,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar82,auVar99,auVar100);
          auVar81 = vsubps_avx512vl(auVar103,ZEXT1632(auVar71));
          auVar238 = ZEXT3264(auVar81);
          auVar197._8_4_ = 0x7f800000;
          auVar197._0_8_ = 0x7f8000007f800000;
          auVar197._12_4_ = 0x7f800000;
          auVar197._16_4_ = 0x7f800000;
          auVar197._20_4_ = 0x7f800000;
          auVar197._24_4_ = 0x7f800000;
          auVar197._28_4_ = 0x7f800000;
          auVar81 = vblendmps_avx512vl(auVar197,auVar102);
          bVar64 = (bool)((byte)uVar60 & 1);
          auVar124._0_4_ = (uint)bVar64 * auVar81._0_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * 0x7f800000;
          bVar64 = SUB81(uVar60 >> 7,0);
          auVar124._28_4_ = (uint)bVar64 * auVar81._28_4_ | (uint)!bVar64 * 0x7f800000;
          auVar221._8_4_ = 0xff800000;
          auVar221._0_8_ = 0xff800000ff800000;
          auVar221._12_4_ = 0xff800000;
          auVar221._16_4_ = 0xff800000;
          auVar221._20_4_ = 0xff800000;
          auVar221._24_4_ = 0xff800000;
          auVar221._28_4_ = 0xff800000;
          auVar81 = vblendmps_avx512vl(auVar221,auVar98);
          bVar64 = (bool)((byte)uVar60 & 1);
          auVar125._0_4_ = (uint)bVar64 * auVar81._0_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar64 * auVar81._4_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar64 * auVar81._8_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar64 * auVar81._12_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar64 * auVar81._16_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar64 * auVar81._20_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar64 * auVar81._24_4_ | (uint)!bVar64 * -0x800000;
          bVar64 = SUB81(uVar60 >> 7,0);
          auVar125._28_4_ = (uint)bVar64 * auVar81._28_4_ | (uint)!bVar64 * -0x800000;
          auVar29._8_4_ = 0x36000000;
          auVar29._0_8_ = 0x3600000036000000;
          auVar29._12_4_ = 0x36000000;
          auVar29._16_4_ = 0x36000000;
          auVar29._20_4_ = 0x36000000;
          auVar29._24_4_ = 0x36000000;
          auVar29._28_4_ = 0x36000000;
          auVar81 = vmulps_avx512vl(local_5c0,auVar29);
          uVar62 = vcmpps_avx512vl(auVar81,local_5e0,0xe);
          uVar60 = uVar60 & uVar62;
          bVar58 = (byte)uVar60;
          if (bVar58 != 0) {
            uVar62 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar72),2);
            auVar243._8_4_ = 0x7f800000;
            auVar243._0_8_ = 0x7f8000007f800000;
            auVar243._12_4_ = 0x7f800000;
            auVar243._16_4_ = 0x7f800000;
            auVar243._20_4_ = 0x7f800000;
            auVar243._24_4_ = 0x7f800000;
            auVar243._28_4_ = 0x7f800000;
            auVar248._8_4_ = 0xff800000;
            auVar248._0_8_ = 0xff800000ff800000;
            auVar248._12_4_ = 0xff800000;
            auVar248._16_4_ = 0xff800000;
            auVar248._20_4_ = 0xff800000;
            auVar248._24_4_ = 0xff800000;
            auVar248._28_4_ = 0xff800000;
            auVar93 = vblendmps_avx512vl(auVar243,auVar248);
            bVar54 = (byte)uVar62;
            uVar67 = (uint)(bVar54 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar81._0_4_;
            bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
            uVar129 = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * auVar81._4_4_;
            bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
            uVar130 = (uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * auVar81._8_4_;
            bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
            uVar131 = (uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * auVar81._12_4_;
            bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
            uVar132 = (uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * auVar81._16_4_;
            bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
            uVar133 = (uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * auVar81._20_4_;
            bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
            uVar134 = (uint)bVar64 * auVar93._24_4_ | (uint)!bVar64 * auVar81._24_4_;
            bVar64 = SUB81(uVar62 >> 7,0);
            uVar135 = (uint)bVar64 * auVar93._28_4_ | (uint)!bVar64 * auVar81._28_4_;
            auVar124._0_4_ = (bVar58 & 1) * uVar67 | !(bool)(bVar58 & 1) * auVar124._0_4_;
            bVar64 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar124._4_4_ = bVar64 * uVar129 | !bVar64 * auVar124._4_4_;
            bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar124._8_4_ = bVar64 * uVar130 | !bVar64 * auVar124._8_4_;
            bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar124._12_4_ = bVar64 * uVar131 | !bVar64 * auVar124._12_4_;
            bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar124._16_4_ = bVar64 * uVar132 | !bVar64 * auVar124._16_4_;
            bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar124._20_4_ = bVar64 * uVar133 | !bVar64 * auVar124._20_4_;
            bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar124._24_4_ = bVar64 * uVar134 | !bVar64 * auVar124._24_4_;
            bVar64 = SUB81(uVar60 >> 7,0);
            auVar124._28_4_ = bVar64 * uVar135 | !bVar64 * auVar124._28_4_;
            auVar93 = vblendmps_avx512vl(auVar248,auVar243);
            bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar62 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar62 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar62 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar62 >> 6) & 1);
            bVar10 = SUB81(uVar62 >> 7,0);
            auVar125._0_4_ =
                 (uint)(bVar58 & 1) *
                 ((uint)(bVar54 & 1) * auVar93._0_4_ | !(bool)(bVar54 & 1) * uVar67) |
                 !(bool)(bVar58 & 1) * auVar125._0_4_;
            bVar4 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar125._4_4_ =
                 (uint)bVar4 * ((uint)bVar64 * auVar93._4_4_ | !bVar64 * uVar129) |
                 !bVar4 * auVar125._4_4_;
            bVar64 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar125._8_4_ =
                 (uint)bVar64 * ((uint)bVar5 * auVar93._8_4_ | !bVar5 * uVar130) |
                 !bVar64 * auVar125._8_4_;
            bVar64 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar125._12_4_ =
                 (uint)bVar64 * ((uint)bVar6 * auVar93._12_4_ | !bVar6 * uVar131) |
                 !bVar64 * auVar125._12_4_;
            bVar64 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar125._16_4_ =
                 (uint)bVar64 * ((uint)bVar7 * auVar93._16_4_ | !bVar7 * uVar132) |
                 !bVar64 * auVar125._16_4_;
            bVar64 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar125._20_4_ =
                 (uint)bVar64 * ((uint)bVar8 * auVar93._20_4_ | !bVar8 * uVar133) |
                 !bVar64 * auVar125._20_4_;
            bVar64 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar125._24_4_ =
                 (uint)bVar64 * ((uint)bVar9 * auVar93._24_4_ | !bVar9 * uVar134) |
                 !bVar64 * auVar125._24_4_;
            bVar64 = SUB81(uVar60 >> 7,0);
            auVar125._28_4_ =
                 (uint)bVar64 * ((uint)bVar10 * auVar93._28_4_ | !bVar10 * uVar135) |
                 !bVar64 * auVar125._28_4_;
            bVar59 = (~bVar58 | bVar54) & bVar59;
          }
        }
        auVar242._0_4_ = (float)local_540._0_4_ * auVar238._0_4_;
        auVar242._4_4_ = (float)local_540._4_4_ * auVar238._4_4_;
        auVar242._8_4_ = fStack_538 * auVar238._8_4_;
        auVar242._12_4_ = fStack_534 * auVar238._12_4_;
        auVar242._16_4_ = fStack_530 * auVar238._16_4_;
        auVar242._20_4_ = fStack_52c * auVar238._20_4_;
        auVar242._28_36_ = auVar238._28_36_;
        auVar242._24_4_ = fStack_528 * auVar238._24_4_;
        auVar71 = vfmadd231ps_fma(auVar242._0_32_,local_520,auVar83);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_500,auVar95);
        auVar241._8_4_ = 0x7fffffff;
        auVar241._0_8_ = 0x7fffffff7fffffff;
        auVar241._12_4_ = 0x7fffffff;
        auVar241._16_4_ = 0x7fffffff;
        auVar241._20_4_ = 0x7fffffff;
        auVar241._24_4_ = 0x7fffffff;
        auVar241._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(ZEXT1632(auVar71),auVar241);
        _local_1c0 = local_4e0;
        auVar237._8_4_ = 0x3e99999a;
        auVar237._0_8_ = 0x3e99999a3e99999a;
        auVar237._12_4_ = 0x3e99999a;
        auVar237._16_4_ = 0x3e99999a;
        auVar237._20_4_ = 0x3e99999a;
        auVar237._24_4_ = 0x3e99999a;
        auVar237._28_4_ = 0x3e99999a;
        uVar13 = vcmpps_avx512vl(auVar93,auVar237,1);
        _local_4c0 = vmaxps_avx(local_4e0,auVar125);
        _local_2c0 = _local_4c0;
        auVar93 = vminps_avx(local_2a0,auVar124);
        uVar15 = vcmpps_avx512vl(local_4e0,auVar93,2);
        bVar58 = (byte)uVar15 & bVar53;
        uVar14 = vcmpps_avx512vl(_local_4c0,local_2a0,2);
        if ((bVar53 & ((byte)uVar14 | (byte)uVar15)) == 0) {
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar257 = ZEXT3264(auVar93);
          auVar224 = ZEXT3264(_DAT_01f7b040);
          auVar255 = ZEXT3264(local_7e0);
          auVar249 = ZEXT3264(local_800);
          auVar251 = ZEXT3264(local_820);
          auVar246 = ZEXT3264(local_840);
          auVar238 = ZEXT3264(local_860);
          auVar242 = ZEXT3264(local_880);
          auVar244 = ZEXT3264(local_8a0);
        }
        else {
          bVar54 = (byte)uVar13 | ~bVar59;
          auVar48._4_4_ = (float)local_540._4_4_ * auVar245._4_4_;
          auVar48._0_4_ = (float)local_540._0_4_ * auVar245._0_4_;
          auVar48._8_4_ = fStack_538 * auVar245._8_4_;
          auVar48._12_4_ = fStack_534 * auVar245._12_4_;
          auVar48._16_4_ = fStack_530 * auVar245._16_4_;
          auVar48._20_4_ = fStack_52c * auVar245._20_4_;
          auVar48._24_4_ = fStack_528 * auVar245._24_4_;
          auVar48._28_4_ = auVar93._28_4_;
          auVar71 = vfmadd213ps_fma(auVar97,local_520,auVar48);
          auVar71 = vfmadd213ps_fma(auVar94,local_500,ZEXT1632(auVar71));
          auVar93 = vandps_avx(ZEXT1632(auVar71),auVar241);
          uVar13 = vcmpps_avx512vl(auVar93,auVar237,1);
          bVar59 = (byte)uVar13 | ~bVar59;
          auVar145._8_4_ = 2;
          auVar145._0_8_ = 0x200000002;
          auVar145._12_4_ = 2;
          auVar145._16_4_ = 2;
          auVar145._20_4_ = 2;
          auVar145._24_4_ = 2;
          auVar145._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar145,auVar30);
          local_280._0_4_ = (uint)(bVar59 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
          bVar64 = (bool)(bVar59 >> 1 & 1);
          local_280._4_4_ = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 2 & 1);
          local_280._8_4_ = (uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 3 & 1);
          local_280._12_4_ = (uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 4 & 1);
          local_280._16_4_ = (uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 5 & 1);
          local_280._20_4_ = (uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar59 >> 6 & 1);
          local_280._24_4_ = (uint)bVar64 * auVar93._24_4_ | (uint)!bVar64 * 2;
          local_280._28_4_ = (uint)(bVar59 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2;
          local_440 = vpbroadcastd_avx512vl();
          uVar13 = vpcmpd_avx512vl(local_440,local_280,5);
          local_4a0 = local_4e0._0_4_ + (float)local_760._0_4_;
          fStack_49c = local_4e0._4_4_ + (float)local_760._4_4_;
          fStack_498 = local_4e0._8_4_ + fStack_758;
          fStack_494 = local_4e0._12_4_ + fStack_754;
          fStack_490 = local_4e0._16_4_ + fStack_750;
          fStack_48c = local_4e0._20_4_ + fStack_74c;
          fStack_488 = local_4e0._24_4_ + fStack_748;
          fStack_484 = local_4e0._28_4_ + fStack_744;
          for (bVar59 = (byte)uVar13 & bVar58; bVar59 != 0; bVar59 = ~bVar61 & bVar59 & (byte)uVar13
              ) {
            auVar146._8_4_ = 0x7f800000;
            auVar146._0_8_ = 0x7f8000007f800000;
            auVar146._12_4_ = 0x7f800000;
            auVar146._16_4_ = 0x7f800000;
            auVar146._20_4_ = 0x7f800000;
            auVar146._24_4_ = 0x7f800000;
            auVar146._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar146,local_4e0);
            auVar126._0_4_ =
                 (uint)(bVar59 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * 0x7f800000;
            auVar126._24_4_ =
                 (uint)(bVar59 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar59 >> 6) * 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar93 = vminps_avx(auVar126,auVar93);
            auVar94 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar94);
            auVar94 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar94);
            uVar13 = vcmpps_avx512vl(auVar126,auVar93,0);
            bVar55 = (byte)uVar13 & bVar59;
            bVar61 = bVar59;
            if (bVar55 != 0) {
              bVar61 = bVar55;
            }
            iVar16 = 0;
            for (uVar67 = (uint)bVar61; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            bVar61 = '\x01' << ((byte)iVar16 & 0x1f);
            uVar67 = *(uint *)(local_1e0 + (uint)(iVar16 << 2));
            uVar129 = *(uint *)(local_1c0 + (uint)(iVar16 << 2));
            fVar151 = auVar12._0_4_;
            if ((float)local_780._0_4_ < 0.0) {
              auVar254 = ZEXT1664(auVar254._0_16_);
              fVar151 = sqrtf((float)local_780._0_4_);
            }
            uVar60 = (ulong)bVar61;
            auVar72 = vminps_avx(local_620._0_16_,local_660._0_16_);
            auVar71 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
            auVar68 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar73 = vminps_avx(auVar72,auVar68);
            auVar72 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar68 = vmaxps_avx(auVar71,auVar72);
            auVar80._8_4_ = 0x7fffffff;
            auVar80._0_8_ = 0x7fffffff7fffffff;
            auVar80._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar73,auVar80);
            auVar72 = vandps_avx(auVar68,auVar80);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar165 = auVar71._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar68,auVar68,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar129),ZEXT416(uVar67),0x10);
            uVar62 = 0;
            while( true ) {
              bVar55 = (byte)uVar60;
              if (uVar62 == 5) break;
              uVar153 = auVar71._0_4_;
              auVar138._4_4_ = uVar153;
              auVar138._0_4_ = uVar153;
              auVar138._8_4_ = uVar153;
              auVar138._12_4_ = uVar153;
              auVar68 = vfmadd132ps_fma(auVar138,ZEXT816(0) << 0x40,local_770);
              auVar72 = vmovshdup_avx(auVar71);
              local_5a0._0_16_ = auVar72;
              fVar200 = 1.0 - auVar72._0_4_;
              auVar72 = vshufps_avx(auVar71,auVar71,0x55);
              fVar167 = auVar72._0_4_;
              auVar176._0_4_ = local_660._0_4_ * fVar167;
              fVar169 = auVar72._4_4_;
              auVar176._4_4_ = local_660._4_4_ * fVar169;
              fVar137 = auVar72._8_4_;
              auVar176._8_4_ = local_660._8_4_ * fVar137;
              fVar171 = auVar72._12_4_;
              auVar176._12_4_ = local_660._12_4_ * fVar171;
              _local_580 = ZEXT416((uint)fVar200);
              auVar201._4_4_ = fVar200;
              auVar201._0_4_ = fVar200;
              auVar201._8_4_ = fVar200;
              auVar201._12_4_ = fVar200;
              auVar72 = vfmadd231ps_fma(auVar176,auVar201,local_620._0_16_);
              auVar216._0_4_ = local_640._0_4_ * fVar167;
              auVar216._4_4_ = local_640._4_4_ * fVar169;
              auVar216._8_4_ = local_640._8_4_ * fVar137;
              auVar216._12_4_ = local_640._12_4_ * fVar171;
              auVar73 = vfmadd231ps_fma(auVar216,auVar201,local_660._0_16_);
              auVar226._0_4_ = fVar167 * (float)local_680._0_4_;
              auVar226._4_4_ = fVar169 * (float)local_680._4_4_;
              auVar226._8_4_ = fVar137 * fStack_678;
              auVar226._12_4_ = fVar171 * fStack_674;
              auVar74 = vfmadd231ps_fma(auVar226,auVar201,local_640._0_16_);
              auVar234._0_4_ = fVar167 * auVar73._0_4_;
              auVar234._4_4_ = fVar169 * auVar73._4_4_;
              auVar234._8_4_ = fVar137 * auVar73._8_4_;
              auVar234._12_4_ = fVar171 * auVar73._12_4_;
              auVar72 = vfmadd231ps_fma(auVar234,auVar201,auVar72);
              auVar177._0_4_ = fVar167 * auVar74._0_4_;
              auVar177._4_4_ = fVar169 * auVar74._4_4_;
              auVar177._8_4_ = fVar137 * auVar74._8_4_;
              auVar177._12_4_ = fVar171 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar177,auVar201,auVar73);
              auVar217._0_4_ = fVar167 * auVar73._0_4_;
              auVar217._4_4_ = fVar169 * auVar73._4_4_;
              auVar217._8_4_ = fVar137 * auVar73._8_4_;
              auVar217._12_4_ = fVar171 * auVar73._12_4_;
              auVar74 = vfmadd231ps_fma(auVar217,auVar72,auVar201);
              auVar72 = vsubps_avx(auVar73,auVar72);
              auVar18._8_4_ = 0x40400000;
              auVar18._0_8_ = 0x4040000040400000;
              auVar18._12_4_ = 0x40400000;
              auVar73 = vmulps_avx512vl(auVar72,auVar18);
              local_560._0_16_ = auVar74;
              auVar68 = vsubps_avx(auVar68,auVar74);
              auVar72 = vdpps_avx(auVar68,auVar68,0x7f);
              fVar167 = auVar72._0_4_;
              local_7c0 = ZEXT1632(auVar71);
              if (fVar167 < 0.0) {
                auVar244._0_4_ = sqrtf(fVar167);
                auVar244._4_60_ = extraout_var;
                auVar71 = auVar244._0_16_;
                uVar60 = extraout_RAX;
              }
              else {
                auVar71 = vsqrtss_avx(auVar72,auVar72);
              }
              local_5c0._0_16_ = vdpps_avx(auVar73,auVar73,0x7f);
              fVar169 = local_5c0._0_4_;
              auVar178._4_12_ = ZEXT812(0) << 0x20;
              auVar178._0_4_ = fVar169;
              local_7a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              fVar137 = local_7a0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
              auVar19._8_4_ = 0x80000000;
              auVar19._0_8_ = 0x8000000080000000;
              auVar19._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_5c0._0_16_,auVar19);
              auVar74 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar74._0_4_;
              local_740._0_4_ = auVar71._0_4_;
              if (fVar169 < auVar69._0_4_) {
                fVar171 = sqrtf(fVar169);
                auVar71 = ZEXT416((uint)local_740._0_4_);
                uVar60 = extraout_RAX_00;
              }
              else {
                auVar74 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar171 = auVar74._0_4_;
              }
              fVar200 = local_7a0._0_4_;
              fVar169 = fVar137 * 1.5 + fVar169 * -0.5 * fVar200 * fVar200 * fVar200;
              auVar139._0_4_ = auVar73._0_4_ * fVar169;
              auVar139._4_4_ = auVar73._4_4_ * fVar169;
              auVar139._8_4_ = auVar73._8_4_ * fVar169;
              auVar139._12_4_ = auVar73._12_4_ * fVar169;
              local_7a0._0_16_ = vdpps_avx(auVar68,auVar139,0x7f);
              fVar200 = auVar71._0_4_;
              auVar140._0_4_ = local_7a0._0_4_ * local_7a0._0_4_;
              auVar140._4_4_ = local_7a0._4_4_ * local_7a0._4_4_;
              auVar140._8_4_ = local_7a0._8_4_ * local_7a0._8_4_;
              auVar140._12_4_ = local_7a0._12_4_ * local_7a0._12_4_;
              auVar72 = vsubps_avx(auVar72,auVar140);
              fVar137 = auVar72._0_4_;
              auVar154._4_12_ = ZEXT812(0) << 0x20;
              auVar154._0_4_ = fVar137;
              auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar154);
              auVar69 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              auVar75 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
              if (fVar137 < 0.0) {
                local_6a0._0_4_ = fVar171;
                local_6c0._0_4_ = auVar69._0_4_;
                local_6d0._4_4_ = fVar169;
                local_6d0._0_4_ = fVar169;
                fStack_6c8 = fVar169;
                fStack_6c4 = fVar169;
                local_6b0 = auVar74;
                fVar137 = sqrtf(fVar137);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar69 = ZEXT416((uint)local_6c0._0_4_);
                auVar71 = ZEXT416((uint)local_740._0_4_);
                uVar60 = extraout_RAX_01;
                auVar74 = local_6b0;
                fVar169 = (float)local_6d0._0_4_;
                fVar174 = (float)local_6d0._4_4_;
                fVar152 = fStack_6c8;
                fVar166 = fStack_6c4;
                fVar171 = (float)local_6a0._0_4_;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                fVar137 = auVar72._0_4_;
                fVar174 = fVar169;
                fVar152 = fVar169;
                fVar166 = fVar169;
              }
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_);
              auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar168 = auVar72._0_4_ * 6.0;
              fVar170 = local_5a0._0_4_ * 6.0;
              auVar202._0_4_ = fVar170 * (float)local_680._0_4_;
              auVar202._4_4_ = fVar170 * (float)local_680._4_4_;
              auVar202._8_4_ = fVar170 * fStack_678;
              auVar202._12_4_ = fVar170 * fStack_674;
              auVar179._4_4_ = fVar168;
              auVar179._0_4_ = fVar168;
              auVar179._8_4_ = fVar168;
              auVar179._12_4_ = fVar168;
              auVar72 = vfmadd132ps_fma(auVar179,auVar202,local_640._0_16_);
              fVar168 = auVar77._0_4_ * 6.0;
              auVar155._4_4_ = fVar168;
              auVar155._0_4_ = fVar168;
              auVar155._8_4_ = fVar168;
              auVar155._12_4_ = fVar168;
              auVar72 = vfmadd132ps_fma(auVar155,auVar72,local_660._0_16_);
              fVar168 = local_580._0_4_ * 6.0;
              auVar180._4_4_ = fVar168;
              auVar180._0_4_ = fVar168;
              auVar180._8_4_ = fVar168;
              auVar180._12_4_ = fVar168;
              auVar72 = vfmadd132ps_fma(auVar180,auVar72,local_620._0_16_);
              auVar156._0_4_ = auVar72._0_4_ * (float)local_5c0._0_4_;
              auVar156._4_4_ = auVar72._4_4_ * (float)local_5c0._0_4_;
              auVar156._8_4_ = auVar72._8_4_ * (float)local_5c0._0_4_;
              auVar156._12_4_ = auVar72._12_4_ * (float)local_5c0._0_4_;
              auVar72 = vdpps_avx(auVar73,auVar72,0x7f);
              fVar168 = auVar72._0_4_;
              auVar181._0_4_ = auVar73._0_4_ * fVar168;
              auVar181._4_4_ = auVar73._4_4_ * fVar168;
              auVar181._8_4_ = auVar73._8_4_ * fVar168;
              auVar181._12_4_ = auVar73._12_4_ * fVar168;
              auVar72 = vsubps_avx(auVar156,auVar181);
              fVar168 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar77 = vmaxss_avx(ZEXT416((uint)fVar165),
                                   ZEXT416((uint)(local_7c0._0_4_ * fVar151 * 1.9073486e-06)));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar73,auVar20);
              auVar182._0_4_ = fVar169 * auVar72._0_4_ * fVar168;
              auVar182._4_4_ = fVar174 * auVar72._4_4_ * fVar168;
              auVar182._8_4_ = fVar152 * auVar72._8_4_ * fVar168;
              auVar182._12_4_ = fVar166 * auVar72._12_4_ * fVar168;
              auVar254 = ZEXT1664(auVar139);
              auVar72 = vdpps_avx(auVar76,auVar139,0x7f);
              auVar78 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar165),auVar77);
              auVar71 = vdpps_avx(auVar68,auVar182,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar200 + 1.0)),
                                        ZEXT416((uint)(fVar165 / fVar171)),auVar78);
              fVar169 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_770,auVar139,0x7f);
              auVar72 = vdpps_avx(auVar68,auVar76,0x7f);
              auVar75 = vmulss_avx512f(auVar75,auVar74);
              auVar74 = vmulss_avx512f(auVar74,auVar74);
              auVar75 = vaddss_avx512f(auVar69,ZEXT416((uint)(auVar75._0_4_ * auVar74._0_4_)));
              auVar74 = vdpps_avx(auVar68,local_770,0x7f);
              auVar76 = vfnmadd231ss_avx512f(auVar72,local_7a0._0_16_,ZEXT416((uint)fVar169));
              auVar74 = vfnmadd231ss_avx512f(auVar74,local_7a0._0_16_,auVar71);
              auVar72 = vpermilps_avx(local_560._0_16_,0xff);
              fVar137 = fVar137 - auVar72._0_4_;
              auVar69 = vshufps_avx(auVar73,auVar73,0xff);
              auVar72 = vfmsub213ss_fma(auVar76,auVar75,auVar69);
              auVar239._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar239._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar74 = ZEXT416((uint)(auVar74._0_4_ * auVar75._0_4_));
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar169),auVar74);
              auVar72 = vinsertps_avx(auVar239,auVar74,0x1c);
              auVar227._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar227._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar227._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar74 = vinsertps_avx(ZEXT416((uint)fVar169),auVar227,0x10);
              auVar203._0_4_ = auVar75._0_4_;
              auVar203._4_4_ = auVar203._0_4_;
              auVar203._8_4_ = auVar203._0_4_;
              auVar203._12_4_ = auVar203._0_4_;
              auVar71 = vdivps_avx(auVar72,auVar203);
              auVar72 = vdivps_avx(auVar74,auVar203);
              auVar74 = vbroadcastss_avx512vl(local_7a0._0_16_);
              auVar204._0_4_ = auVar74._0_4_ * auVar71._0_4_ + fVar137 * auVar72._0_4_;
              auVar204._4_4_ = auVar74._4_4_ * auVar71._4_4_ + fVar137 * auVar72._4_4_;
              auVar204._8_4_ = auVar74._8_4_ * auVar71._8_4_ + fVar137 * auVar72._8_4_;
              auVar204._12_4_ = auVar74._12_4_ * auVar71._12_4_ + fVar137 * auVar72._12_4_;
              auVar71 = vsubps_avx(local_7c0._0_16_,auVar204);
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(local_7a0._0_16_,auVar21);
              if (auVar72._0_4_ < auVar78._0_4_) {
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar77._0_4_)),local_6e0,
                                          ZEXT416(0x36000000));
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar74 = vandps_avx512vl(ZEXT416((uint)fVar137),auVar22);
                if (auVar74._0_4_ < auVar72._0_4_) {
                  bVar64 = uVar62 < 5;
                  fVar151 = auVar71._0_4_ + (float)local_6f0._0_4_;
                  if ((fVar253 <= fVar151) &&
                     (fVar165 = *(float *)(ray + k * 4 + 0x100), fVar151 <= fVar165)) {
                    auVar72 = vmovshdup_avx(auVar71);
                    bVar55 = 0;
                    if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_01a7cfaa;
                    auVar205._0_12_ = ZEXT812(0);
                    auVar205._12_4_ = 0;
                    auVar183._4_8_ = auVar205._4_8_;
                    auVar183._0_4_ = fVar167;
                    auVar183._12_4_ = 0;
                    auVar72 = vrsqrt14ss_avx512f(auVar205,auVar183);
                    fVar169 = auVar72._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar55 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01a7cfaa;
                      fVar167 = fVar169 * 1.5 + fVar167 * -0.5 * fVar169 * fVar169 * fVar169;
                      auVar184._0_4_ = auVar68._0_4_ * fVar167;
                      auVar184._4_4_ = auVar68._4_4_ * fVar167;
                      auVar184._8_4_ = auVar68._8_4_ * fVar167;
                      auVar184._12_4_ = auVar68._12_4_ * fVar167;
                      auVar74 = vfmadd213ps_fma(auVar69,auVar184,auVar73);
                      auVar72 = vshufps_avx(auVar184,auVar184,0xc9);
                      auVar68 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar185._0_4_ = auVar184._0_4_ * auVar68._0_4_;
                      auVar185._4_4_ = auVar184._4_4_ * auVar68._4_4_;
                      auVar185._8_4_ = auVar184._8_4_ * auVar68._8_4_;
                      auVar185._12_4_ = auVar184._12_4_ * auVar68._12_4_;
                      auVar73 = vfmsub231ps_fma(auVar185,auVar73,auVar72);
                      auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar68 = vshufps_avx(auVar74,auVar74,0xc9);
                      auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                      auVar141._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                      auVar141._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                      auVar141._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                      auVar141._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar141,auVar72,auVar68);
                      auVar213._8_4_ = 1;
                      auVar213._0_8_ = 0x100000001;
                      auVar213._12_4_ = 1;
                      auVar213._16_4_ = 1;
                      auVar213._20_4_ = 1;
                      auVar213._24_4_ = 1;
                      auVar213._28_4_ = 1;
                      local_380 = vpermps_avx2(auVar213,ZEXT1632(auVar71));
                      auVar93 = vpermps_avx2(auVar213,ZEXT1632(auVar72));
                      auVar222._8_4_ = 2;
                      auVar222._0_8_ = 0x200000002;
                      auVar222._12_4_ = 2;
                      auVar222._16_4_ = 2;
                      auVar222._20_4_ = 2;
                      auVar222._24_4_ = 2;
                      auVar222._28_4_ = 2;
                      local_3c0 = vpermps_avx2(auVar222,ZEXT1632(auVar72));
                      local_3a0 = auVar72._0_4_;
                      local_3e0[0] = (RTCHitN)auVar93[0];
                      local_3e0[1] = (RTCHitN)auVar93[1];
                      local_3e0[2] = (RTCHitN)auVar93[2];
                      local_3e0[3] = (RTCHitN)auVar93[3];
                      local_3e0[4] = (RTCHitN)auVar93[4];
                      local_3e0[5] = (RTCHitN)auVar93[5];
                      local_3e0[6] = (RTCHitN)auVar93[6];
                      local_3e0[7] = (RTCHitN)auVar93[7];
                      local_3e0[8] = (RTCHitN)auVar93[8];
                      local_3e0[9] = (RTCHitN)auVar93[9];
                      local_3e0[10] = (RTCHitN)auVar93[10];
                      local_3e0[0xb] = (RTCHitN)auVar93[0xb];
                      local_3e0[0xc] = (RTCHitN)auVar93[0xc];
                      local_3e0[0xd] = (RTCHitN)auVar93[0xd];
                      local_3e0[0xe] = (RTCHitN)auVar93[0xe];
                      local_3e0[0xf] = (RTCHitN)auVar93[0xf];
                      local_3e0[0x10] = (RTCHitN)auVar93[0x10];
                      local_3e0[0x11] = (RTCHitN)auVar93[0x11];
                      local_3e0[0x12] = (RTCHitN)auVar93[0x12];
                      local_3e0[0x13] = (RTCHitN)auVar93[0x13];
                      local_3e0[0x14] = (RTCHitN)auVar93[0x14];
                      local_3e0[0x15] = (RTCHitN)auVar93[0x15];
                      local_3e0[0x16] = (RTCHitN)auVar93[0x16];
                      local_3e0[0x17] = (RTCHitN)auVar93[0x17];
                      local_3e0[0x18] = (RTCHitN)auVar93[0x18];
                      local_3e0[0x19] = (RTCHitN)auVar93[0x19];
                      local_3e0[0x1a] = (RTCHitN)auVar93[0x1a];
                      local_3e0[0x1b] = (RTCHitN)auVar93[0x1b];
                      local_3e0[0x1c] = (RTCHitN)auVar93[0x1c];
                      local_3e0[0x1d] = (RTCHitN)auVar93[0x1d];
                      local_3e0[0x1e] = (RTCHitN)auVar93[0x1e];
                      local_3e0[0x1f] = (RTCHitN)auVar93[0x1f];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_360 = ZEXT432(0) << 0x20;
                      local_340 = local_400._0_8_;
                      uStack_338 = local_400._8_8_;
                      uStack_330 = local_400._16_8_;
                      uStack_328 = local_400._24_8_;
                      local_320 = local_420;
                      vpcmpeqd_avx2(local_420,local_420);
                      local_300 = context->user->instID[0];
                      uStack_2fc = local_300;
                      uStack_2f8 = local_300;
                      uStack_2f4 = local_300;
                      uStack_2f0 = local_300;
                      uStack_2ec = local_300;
                      uStack_2e8 = local_300;
                      uStack_2e4 = local_300;
                      local_2e0 = context->user->instPrimID[0];
                      uStack_2dc = local_2e0;
                      uStack_2d8 = local_2e0;
                      uStack_2d4 = local_2e0;
                      uStack_2d0 = local_2e0;
                      uStack_2cc = local_2e0;
                      uStack_2c8 = local_2e0;
                      uStack_2c4 = local_2e0;
                      *(float *)(ray + k * 4 + 0x100) = fVar151;
                      local_720 = local_460;
                      local_8d0.valid = (int *)local_720;
                      local_8d0.geometryUserPtr = pGVar2->userPtr;
                      local_8d0.context = context->user;
                      local_8d0.hit = local_3e0;
                      local_8d0.N = 8;
                      local_8d0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar254 = ZEXT1664(auVar139);
                        (*pGVar2->occlusionFilterN)(&local_8d0);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          (*p_Var3)(&local_8d0);
                        }
                        uVar60 = vptestmd_avx512vl(local_720,local_720);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar60 & 1);
                        bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar60 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar60 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar60 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar60 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
                        bVar11 = SUB81(uVar60 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x100) =
                             (uint)bVar4 * auVar93._0_4_ |
                             (uint)!bVar4 * *(int *)(local_8d0.ray + 0x100);
                        *(uint *)(local_8d0.ray + 0x104) =
                             (uint)bVar5 * auVar93._4_4_ |
                             (uint)!bVar5 * *(int *)(local_8d0.ray + 0x104);
                        *(uint *)(local_8d0.ray + 0x108) =
                             (uint)bVar6 * auVar93._8_4_ |
                             (uint)!bVar6 * *(int *)(local_8d0.ray + 0x108);
                        *(uint *)(local_8d0.ray + 0x10c) =
                             (uint)bVar7 * auVar93._12_4_ |
                             (uint)!bVar7 * *(int *)(local_8d0.ray + 0x10c);
                        *(uint *)(local_8d0.ray + 0x110) =
                             (uint)bVar8 * auVar93._16_4_ |
                             (uint)!bVar8 * *(int *)(local_8d0.ray + 0x110);
                        *(uint *)(local_8d0.ray + 0x114) =
                             (uint)bVar9 * auVar93._20_4_ |
                             (uint)!bVar9 * *(int *)(local_8d0.ray + 0x114);
                        *(uint *)(local_8d0.ray + 0x118) =
                             (uint)bVar10 * auVar93._24_4_ |
                             (uint)!bVar10 * *(int *)(local_8d0.ray + 0x118);
                        *(uint *)(local_8d0.ray + 0x11c) =
                             (uint)bVar11 * auVar93._28_4_ |
                             (uint)!bVar11 * *(int *)(local_8d0.ray + 0x11c);
                        bVar55 = 1;
                        if (local_720 != (undefined1  [32])0x0) goto LAB_01a7cfaa;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar165;
                    }
                  }
                  bVar55 = 0;
                  goto LAB_01a7cfaa;
                }
              }
              uVar62 = uVar62 + 1;
            }
            bVar64 = false;
LAB_01a7cfaa:
            bVar56 = bVar56 | bVar64 & bVar55;
            uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar231._4_4_ = uVar153;
            auVar231._0_4_ = uVar153;
            auVar231._8_4_ = uVar153;
            auVar231._12_4_ = uVar153;
            auVar231._16_4_ = uVar153;
            auVar231._20_4_ = uVar153;
            auVar231._24_4_ = uVar153;
            auVar231._28_4_ = uVar153;
            auVar224 = ZEXT3264(auVar231);
            auVar50._4_4_ = fStack_49c;
            auVar50._0_4_ = local_4a0;
            auVar50._8_4_ = fStack_498;
            auVar50._12_4_ = fStack_494;
            auVar50._16_4_ = fStack_490;
            auVar50._20_4_ = fStack_48c;
            auVar50._24_4_ = fStack_488;
            auVar50._28_4_ = fStack_484;
            uVar13 = vcmpps_avx512vl(auVar231,auVar50,0xd);
          }
          auVar147._0_4_ = (float)local_760._0_4_ + (float)local_4c0._0_4_;
          auVar147._4_4_ = (float)local_760._4_4_ + (float)local_4c0._4_4_;
          auVar147._8_4_ = fStack_758 + fStack_4b8;
          auVar147._12_4_ = fStack_754 + fStack_4b4;
          auVar147._16_4_ = fStack_750 + fStack_4b0;
          auVar147._20_4_ = fStack_74c + fStack_4ac;
          auVar147._24_4_ = fStack_748 + fStack_4a8;
          auVar147._28_4_ = fStack_744 + fStack_4a4;
          uVar153 = auVar224._0_4_;
          auVar161._4_4_ = uVar153;
          auVar161._0_4_ = uVar153;
          auVar161._8_4_ = uVar153;
          auVar161._12_4_ = uVar153;
          auVar161._16_4_ = uVar153;
          auVar161._20_4_ = uVar153;
          auVar161._24_4_ = uVar153;
          auVar161._28_4_ = uVar153;
          uVar13 = vcmpps_avx512vl(auVar147,auVar161,2);
          auVar148._8_4_ = 2;
          auVar148._0_8_ = 0x200000002;
          auVar148._12_4_ = 2;
          auVar148._16_4_ = 2;
          auVar148._20_4_ = 2;
          auVar148._24_4_ = 2;
          auVar148._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar148,auVar31);
          local_4c0._0_4_ = (uint)(bVar54 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar54 & 1) * 2;
          bVar64 = (bool)(bVar54 >> 1 & 1);
          local_4c0._4_4_ = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * 2;
          bVar64 = (bool)(bVar54 >> 2 & 1);
          fStack_4b8 = (float)((uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)(bVar54 >> 3 & 1);
          fStack_4b4 = (float)((uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)(bVar54 >> 4 & 1);
          fStack_4b0 = (float)((uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)(bVar54 >> 5 & 1);
          fStack_4ac = (float)((uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * 2);
          bVar64 = (bool)(bVar54 >> 6 & 1);
          fStack_4a8 = (float)((uint)bVar64 * auVar93._24_4_ | (uint)!bVar64 * 2);
          fStack_4a4 = (float)((uint)(bVar54 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar54 >> 7) * 2
                              );
          bVar53 = (byte)uVar14 & bVar53 & (byte)uVar13;
          uVar13 = vpcmpd_avx512vl(_local_4c0,local_440,2);
          local_4e0 = _local_2c0;
          local_4a0 = (float)local_760._0_4_ + (float)local_2c0._0_4_;
          fStack_49c = (float)local_760._4_4_ + (float)local_2c0._4_4_;
          fStack_498 = fStack_758 + fStack_2b8;
          fStack_494 = fStack_754 + fStack_2b4;
          fStack_490 = fStack_750 + fStack_2b0;
          fStack_48c = fStack_74c + fStack_2ac;
          fStack_488 = fStack_748 + fStack_2a8;
          fStack_484 = fStack_744 + fStack_2a4;
          auVar255 = ZEXT3264(local_7e0);
          auVar249 = ZEXT3264(local_800);
          auVar251 = ZEXT3264(local_820);
          auVar246 = ZEXT3264(local_840);
          auVar238 = ZEXT3264(local_860);
          auVar242 = ZEXT3264(local_880);
          auVar244 = ZEXT3264(local_8a0);
          for (bVar59 = (byte)uVar13 & bVar53; bVar59 != 0; bVar59 = ~bVar54 & bVar59 & (byte)uVar13
              ) {
            auVar149._8_4_ = 0x7f800000;
            auVar149._0_8_ = 0x7f8000007f800000;
            auVar149._12_4_ = 0x7f800000;
            auVar149._16_4_ = 0x7f800000;
            auVar149._20_4_ = 0x7f800000;
            auVar149._24_4_ = 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar149,local_4e0);
            auVar127._0_4_ =
                 (uint)(bVar59 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar64 * auVar93._4_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar64 * auVar93._8_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar64 * auVar93._12_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar64 * auVar93._16_4_ | (uint)!bVar64 * 0x7f800000;
            bVar64 = (bool)(bVar59 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar64 * auVar93._20_4_ | (uint)!bVar64 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar59 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar59 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar93 = vminps_avx(auVar127,auVar93);
            auVar94 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar94);
            auVar94 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar94);
            uVar13 = vcmpps_avx512vl(auVar127,auVar93,0);
            bVar61 = (byte)uVar13 & bVar59;
            bVar54 = bVar59;
            if (bVar61 != 0) {
              bVar54 = bVar61;
            }
            iVar16 = 0;
            for (uVar67 = (uint)bVar54; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
              iVar16 = iVar16 + 1;
            }
            bVar54 = '\x01' << ((byte)iVar16 & 0x1f);
            uVar67 = *(uint *)(local_200 + (uint)(iVar16 << 2));
            uVar129 = *(uint *)(local_2a0 + (uint)(iVar16 << 2));
            fVar151 = auVar70._0_4_;
            if ((float)local_780._0_4_ < 0.0) {
              auVar254 = ZEXT1664(auVar254._0_16_);
              fVar151 = sqrtf((float)local_780._0_4_);
              auVar244 = ZEXT3264(local_8a0);
              auVar242 = ZEXT3264(local_880);
              auVar238 = ZEXT3264(local_860);
              auVar246 = ZEXT3264(local_840);
              auVar251 = ZEXT3264(local_820);
              auVar249 = ZEXT3264(local_800);
              auVar255 = ZEXT3264(local_7e0);
            }
            uVar60 = (ulong)bVar54;
            auVar72 = vminps_avx(local_620._0_16_,local_660._0_16_);
            auVar71 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
            auVar68 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar73 = vminps_avx(auVar72,auVar68);
            auVar72 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar68 = vmaxps_avx(auVar71,auVar72);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar73,auVar206);
            auVar72 = vandps_avx(auVar68,auVar206);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar165 = auVar71._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar68,auVar68,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar129),ZEXT416(uVar67),0x10);
            uVar62 = 0;
            while( true ) {
              bVar61 = (byte)uVar60;
              if (uVar62 == 5) break;
              uVar153 = auVar71._0_4_;
              auVar142._4_4_ = uVar153;
              auVar142._0_4_ = uVar153;
              auVar142._8_4_ = uVar153;
              auVar142._12_4_ = uVar153;
              auVar68 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_770);
              auVar72 = vmovshdup_avx(auVar71);
              local_5a0._0_16_ = auVar72;
              fVar200 = 1.0 - auVar72._0_4_;
              auVar72 = vshufps_avx(auVar71,auVar71,0x55);
              fVar167 = auVar72._0_4_;
              auVar186._0_4_ = local_660._0_4_ * fVar167;
              fVar169 = auVar72._4_4_;
              auVar186._4_4_ = local_660._4_4_ * fVar169;
              fVar137 = auVar72._8_4_;
              auVar186._8_4_ = local_660._8_4_ * fVar137;
              fVar171 = auVar72._12_4_;
              auVar186._12_4_ = local_660._12_4_ * fVar171;
              _local_580 = ZEXT416((uint)fVar200);
              auVar207._4_4_ = fVar200;
              auVar207._0_4_ = fVar200;
              auVar207._8_4_ = fVar200;
              auVar207._12_4_ = fVar200;
              auVar72 = vfmadd231ps_fma(auVar186,auVar207,local_620._0_16_);
              auVar218._0_4_ = local_640._0_4_ * fVar167;
              auVar218._4_4_ = local_640._4_4_ * fVar169;
              auVar218._8_4_ = local_640._8_4_ * fVar137;
              auVar218._12_4_ = local_640._12_4_ * fVar171;
              auVar73 = vfmadd231ps_fma(auVar218,auVar207,local_660._0_16_);
              auVar228._0_4_ = fVar167 * (float)local_680._0_4_;
              auVar228._4_4_ = fVar169 * (float)local_680._4_4_;
              auVar228._8_4_ = fVar137 * fStack_678;
              auVar228._12_4_ = fVar171 * fStack_674;
              auVar74 = vfmadd231ps_fma(auVar228,auVar207,local_640._0_16_);
              auVar235._0_4_ = fVar167 * auVar73._0_4_;
              auVar235._4_4_ = fVar169 * auVar73._4_4_;
              auVar235._8_4_ = fVar137 * auVar73._8_4_;
              auVar235._12_4_ = fVar171 * auVar73._12_4_;
              auVar72 = vfmadd231ps_fma(auVar235,auVar207,auVar72);
              auVar187._0_4_ = fVar167 * auVar74._0_4_;
              auVar187._4_4_ = fVar169 * auVar74._4_4_;
              auVar187._8_4_ = fVar137 * auVar74._8_4_;
              auVar187._12_4_ = fVar171 * auVar74._12_4_;
              auVar73 = vfmadd231ps_fma(auVar187,auVar207,auVar73);
              auVar219._0_4_ = fVar167 * auVar73._0_4_;
              auVar219._4_4_ = fVar169 * auVar73._4_4_;
              auVar219._8_4_ = fVar137 * auVar73._8_4_;
              auVar219._12_4_ = fVar171 * auVar73._12_4_;
              auVar74 = vfmadd231ps_fma(auVar219,auVar72,auVar207);
              auVar72 = vsubps_avx(auVar73,auVar72);
              auVar23._8_4_ = 0x40400000;
              auVar23._0_8_ = 0x4040000040400000;
              auVar23._12_4_ = 0x40400000;
              auVar73 = vmulps_avx512vl(auVar72,auVar23);
              local_560._0_16_ = auVar74;
              auVar68 = vsubps_avx(auVar68,auVar74);
              auVar72 = vdpps_avx(auVar68,auVar68,0x7f);
              fVar167 = auVar72._0_4_;
              local_7c0 = ZEXT1632(auVar71);
              if (fVar167 < 0.0) {
                auVar246._0_4_ = sqrtf(fVar167);
                auVar246._4_60_ = extraout_var_00;
                auVar71 = auVar246._0_16_;
                uVar60 = extraout_RAX_02;
              }
              else {
                auVar71 = vsqrtss_avx(auVar72,auVar72);
              }
              local_5c0._0_16_ = vdpps_avx(auVar73,auVar73,0x7f);
              fVar169 = local_5c0._0_4_;
              auVar188._4_12_ = ZEXT812(0) << 0x20;
              auVar188._0_4_ = fVar169;
              local_7a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              fVar137 = local_7a0._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_5c0._0_16_,auVar24);
              auVar74 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar74._0_4_;
              local_740._0_4_ = auVar71._0_4_;
              if (fVar169 < auVar69._0_4_) {
                fVar171 = sqrtf(fVar169);
                auVar71 = ZEXT416((uint)local_740._0_4_);
                uVar60 = extraout_RAX_03;
              }
              else {
                auVar74 = vsqrtss_avx(local_5c0._0_16_,local_5c0._0_16_);
                fVar171 = auVar74._0_4_;
              }
              fVar200 = local_7a0._0_4_;
              auVar75 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar137 * 1.5 +
                                                 fVar169 * -0.5 * fVar200 * fVar200 * fVar200)));
              auVar74 = vmulps_avx512vl(auVar75,auVar73);
              local_7a0._0_16_ = vdpps_avx(auVar74,auVar68,0x7f);
              auVar77 = vaddss_avx512f(auVar71,ZEXT416(0x3f800000));
              auVar143._0_4_ = local_7a0._0_4_ * local_7a0._0_4_;
              auVar143._4_4_ = local_7a0._4_4_ * local_7a0._4_4_;
              auVar143._8_4_ = local_7a0._8_4_ * local_7a0._8_4_;
              auVar143._12_4_ = local_7a0._12_4_ * local_7a0._12_4_;
              auVar72 = vsubps_avx(auVar72,auVar143);
              fVar169 = auVar72._0_4_;
              auVar157._4_12_ = ZEXT812(0) << 0x20;
              auVar157._0_4_ = fVar169;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar157);
              auVar78 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
              uVar66 = fVar169 == 0.0;
              uVar65 = fVar169 < 0.0;
              if ((bool)uVar65) {
                local_6b0._0_4_ = auVar78._0_4_;
                _local_6d0 = auVar75;
                local_6c0 = auVar74;
                local_6a0 = auVar69;
                fVar169 = sqrtf(fVar169);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar78 = ZEXT416((uint)local_6b0._0_4_);
                auVar71 = ZEXT416((uint)local_740._0_4_);
                auVar77 = ZEXT416(auVar77._0_4_);
                uVar60 = extraout_RAX_04;
                auVar74 = local_6c0;
                auVar69 = local_6a0;
                auVar75 = _local_6d0;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                fVar169 = auVar72._0_4_;
              }
              auVar254 = ZEXT1664(auVar74);
              auVar255 = ZEXT3264(local_7e0);
              auVar249 = ZEXT3264(local_800);
              auVar251 = ZEXT3264(local_820);
              auVar246 = ZEXT3264(local_840);
              auVar233 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_580,local_5a0._0_16_)
              ;
              auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5a0._0_16_,_local_580);
              fVar137 = auVar72._0_4_ * 6.0;
              fVar200 = local_5a0._0_4_ * 6.0;
              auVar208._0_4_ = fVar200 * (float)local_680._0_4_;
              auVar208._4_4_ = fVar200 * (float)local_680._4_4_;
              auVar208._8_4_ = fVar200 * fStack_678;
              auVar208._12_4_ = fVar200 * fStack_674;
              auVar189._4_4_ = fVar137;
              auVar189._0_4_ = fVar137;
              auVar189._8_4_ = fVar137;
              auVar189._12_4_ = fVar137;
              auVar72 = vfmadd132ps_fma(auVar189,auVar208,local_640._0_16_);
              fVar137 = auVar233._0_4_ * 6.0;
              auVar158._4_4_ = fVar137;
              auVar158._0_4_ = fVar137;
              auVar158._8_4_ = fVar137;
              auVar158._12_4_ = fVar137;
              auVar72 = vfmadd132ps_fma(auVar158,auVar72,local_660._0_16_);
              fVar137 = local_580._0_4_ * 6.0;
              auVar190._4_4_ = fVar137;
              auVar190._0_4_ = fVar137;
              auVar190._8_4_ = fVar137;
              auVar190._12_4_ = fVar137;
              auVar72 = vfmadd132ps_fma(auVar190,auVar72,local_620._0_16_);
              auVar159._0_4_ = auVar72._0_4_ * (float)local_5c0._0_4_;
              auVar159._4_4_ = auVar72._4_4_ * (float)local_5c0._0_4_;
              auVar159._8_4_ = auVar72._8_4_ * (float)local_5c0._0_4_;
              auVar159._12_4_ = auVar72._12_4_ * (float)local_5c0._0_4_;
              auVar72 = vdpps_avx(auVar73,auVar72,0x7f);
              fVar137 = auVar72._0_4_;
              auVar191._0_4_ = auVar73._0_4_ * fVar137;
              auVar191._4_4_ = auVar73._4_4_ * fVar137;
              auVar191._8_4_ = auVar73._8_4_ * fVar137;
              auVar191._12_4_ = auVar73._12_4_ * fVar137;
              auVar72 = vsubps_avx(auVar159,auVar191);
              fVar137 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar233 = vmaxss_avx(ZEXT416((uint)fVar165),
                                    ZEXT416((uint)(local_7c0._0_4_ * fVar151 * 1.9073486e-06)));
              auVar192._0_4_ = auVar72._0_4_ * fVar137;
              auVar192._4_4_ = auVar72._4_4_ * fVar137;
              auVar192._8_4_ = auVar72._8_4_ * fVar137;
              auVar192._12_4_ = auVar72._12_4_ * fVar137;
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar73,auVar25);
              auVar80 = vmulps_avx512vl(auVar75,auVar192);
              auVar72 = vdpps_avx(auVar79,auVar74,0x7f);
              auVar75 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar165),auVar233);
              auVar71 = vdpps_avx(auVar68,auVar80,0x7f);
              vfmadd213ss_avx512f(auVar77,ZEXT416((uint)(fVar165 / fVar171)),auVar75);
              fVar137 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_770,auVar74,0x7f);
              auVar72 = vdpps_avx(auVar68,auVar79,0x7f);
              auVar75 = vmulss_avx512f(auVar76,auVar69);
              auVar69 = vmulss_avx512f(auVar69,auVar69);
              auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar75._0_4_ * auVar69._0_4_)));
              auVar69 = vdpps_avx(auVar68,local_770,0x7f);
              auVar77 = vfnmadd231ss_fma(auVar72,local_7a0._0_16_,ZEXT416((uint)fVar137));
              auVar69 = vfnmadd231ss_fma(auVar69,local_7a0._0_16_,auVar71);
              auVar72 = vpermilps_avx(local_560._0_16_,0xff);
              fVar169 = fVar169 - auVar72._0_4_;
              auVar75 = vshufps_avx(auVar73,auVar73,0xff);
              auVar72 = vfmsub213ss_fma(auVar77,auVar78,auVar75);
              auVar240._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar240._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar240._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * auVar78._0_4_));
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar137),auVar69);
              auVar72 = vinsertps_avx(auVar240,auVar69,0x1c);
              auVar229._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar229._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar229._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar137),auVar229,0x10);
              auVar209._0_4_ = auVar77._0_4_;
              auVar209._4_4_ = auVar209._0_4_;
              auVar209._8_4_ = auVar209._0_4_;
              auVar209._12_4_ = auVar209._0_4_;
              auVar71 = vdivps_avx(auVar72,auVar209);
              auVar72 = vdivps_avx(auVar69,auVar209);
              fVar137 = local_7a0._0_4_;
              auVar210._0_4_ = fVar137 * auVar71._0_4_ + fVar169 * auVar72._0_4_;
              auVar210._4_4_ = fVar137 * auVar71._4_4_ + fVar169 * auVar72._4_4_;
              auVar210._8_4_ = fVar137 * auVar71._8_4_ + fVar169 * auVar72._8_4_;
              auVar210._12_4_ = fVar137 * auVar71._12_4_ + fVar169 * auVar72._12_4_;
              auVar71 = vsubps_avx(local_7c0._0_16_,auVar210);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(local_7a0._0_16_,auVar26);
              auVar72 = vucomiss_avx512f(auVar72);
              if (!(bool)uVar65 && !(bool)uVar66) {
                auVar72 = vaddss_avx512f(auVar233,auVar72);
                auVar72 = vfmadd231ss_fma(auVar72,local_6e0,ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar169),auVar27);
                if (auVar69._0_4_ < auVar72._0_4_) {
                  bVar64 = uVar62 < 5;
                  fVar151 = auVar71._0_4_ + (float)local_6f0._0_4_;
                  auVar238 = ZEXT3264(local_860);
                  auVar242 = ZEXT3264(local_880);
                  auVar244 = ZEXT3264(local_8a0);
                  if ((fVar253 <= fVar151) &&
                     (fVar165 = *(float *)(ray + k * 4 + 0x100), fVar151 <= fVar165)) {
                    auVar72 = vmovshdup_avx(auVar71);
                    bVar61 = 0;
                    if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_01a7db81;
                    auVar211._0_12_ = ZEXT812(0);
                    auVar211._12_4_ = 0;
                    auVar193._4_8_ = auVar211._4_8_;
                    auVar193._0_4_ = fVar167;
                    auVar193._12_4_ = 0;
                    auVar72 = vrsqrt14ss_avx512f(auVar211,auVar193);
                    fVar169 = auVar72._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar61 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01a7db81;
                      fVar167 = fVar169 * 1.5 + fVar167 * -0.5 * fVar169 * fVar169 * fVar169;
                      local_960 = auVar68._0_4_;
                      fStack_95c = auVar68._4_4_;
                      fStack_958 = auVar68._8_4_;
                      fStack_954 = auVar68._12_4_;
                      auVar194._0_4_ = fVar167 * local_960;
                      auVar194._4_4_ = fVar167 * fStack_95c;
                      auVar194._8_4_ = fVar167 * fStack_958;
                      auVar194._12_4_ = fVar167 * fStack_954;
                      auVar69 = vfmadd213ps_fma(auVar75,auVar194,auVar73);
                      auVar72 = vshufps_avx(auVar194,auVar194,0xc9);
                      auVar68 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar195._0_4_ = auVar194._0_4_ * auVar68._0_4_;
                      auVar195._4_4_ = auVar194._4_4_ * auVar68._4_4_;
                      auVar195._8_4_ = auVar194._8_4_ * auVar68._8_4_;
                      auVar195._12_4_ = auVar194._12_4_ * auVar68._12_4_;
                      auVar73 = vfmsub231ps_fma(auVar195,auVar73,auVar72);
                      auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar68 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                      auVar144._0_4_ = auVar69._0_4_ * auVar73._0_4_;
                      auVar144._4_4_ = auVar69._4_4_ * auVar73._4_4_;
                      auVar144._8_4_ = auVar69._8_4_ * auVar73._8_4_;
                      auVar144._12_4_ = auVar69._12_4_ * auVar73._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar144,auVar72,auVar68);
                      auVar214._8_4_ = 1;
                      auVar214._0_8_ = 0x100000001;
                      auVar214._12_4_ = 1;
                      auVar214._16_4_ = 1;
                      auVar214._20_4_ = 1;
                      auVar214._24_4_ = 1;
                      auVar214._28_4_ = 1;
                      local_380 = vpermps_avx2(auVar214,ZEXT1632(auVar71));
                      auVar93 = vpermps_avx2(auVar214,ZEXT1632(auVar72));
                      auVar223._8_4_ = 2;
                      auVar223._0_8_ = 0x200000002;
                      auVar223._12_4_ = 2;
                      auVar223._16_4_ = 2;
                      auVar223._20_4_ = 2;
                      auVar223._24_4_ = 2;
                      auVar223._28_4_ = 2;
                      local_3c0 = vpermps_avx2(auVar223,ZEXT1632(auVar72));
                      local_3a0 = auVar72._0_4_;
                      local_3e0[0] = (RTCHitN)auVar93[0];
                      local_3e0[1] = (RTCHitN)auVar93[1];
                      local_3e0[2] = (RTCHitN)auVar93[2];
                      local_3e0[3] = (RTCHitN)auVar93[3];
                      local_3e0[4] = (RTCHitN)auVar93[4];
                      local_3e0[5] = (RTCHitN)auVar93[5];
                      local_3e0[6] = (RTCHitN)auVar93[6];
                      local_3e0[7] = (RTCHitN)auVar93[7];
                      local_3e0[8] = (RTCHitN)auVar93[8];
                      local_3e0[9] = (RTCHitN)auVar93[9];
                      local_3e0[10] = (RTCHitN)auVar93[10];
                      local_3e0[0xb] = (RTCHitN)auVar93[0xb];
                      local_3e0[0xc] = (RTCHitN)auVar93[0xc];
                      local_3e0[0xd] = (RTCHitN)auVar93[0xd];
                      local_3e0[0xe] = (RTCHitN)auVar93[0xe];
                      local_3e0[0xf] = (RTCHitN)auVar93[0xf];
                      local_3e0[0x10] = (RTCHitN)auVar93[0x10];
                      local_3e0[0x11] = (RTCHitN)auVar93[0x11];
                      local_3e0[0x12] = (RTCHitN)auVar93[0x12];
                      local_3e0[0x13] = (RTCHitN)auVar93[0x13];
                      local_3e0[0x14] = (RTCHitN)auVar93[0x14];
                      local_3e0[0x15] = (RTCHitN)auVar93[0x15];
                      local_3e0[0x16] = (RTCHitN)auVar93[0x16];
                      local_3e0[0x17] = (RTCHitN)auVar93[0x17];
                      local_3e0[0x18] = (RTCHitN)auVar93[0x18];
                      local_3e0[0x19] = (RTCHitN)auVar93[0x19];
                      local_3e0[0x1a] = (RTCHitN)auVar93[0x1a];
                      local_3e0[0x1b] = (RTCHitN)auVar93[0x1b];
                      local_3e0[0x1c] = (RTCHitN)auVar93[0x1c];
                      local_3e0[0x1d] = (RTCHitN)auVar93[0x1d];
                      local_3e0[0x1e] = (RTCHitN)auVar93[0x1e];
                      local_3e0[0x1f] = (RTCHitN)auVar93[0x1f];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_360 = ZEXT432(0) << 0x20;
                      local_340 = local_400._0_8_;
                      uStack_338 = local_400._8_8_;
                      uStack_330 = local_400._16_8_;
                      uStack_328 = local_400._24_8_;
                      local_320 = local_420;
                      vpcmpeqd_avx2(local_420,local_420);
                      local_300 = context->user->instID[0];
                      uStack_2fc = local_300;
                      uStack_2f8 = local_300;
                      uStack_2f4 = local_300;
                      uStack_2f0 = local_300;
                      uStack_2ec = local_300;
                      uStack_2e8 = local_300;
                      uStack_2e4 = local_300;
                      local_2e0 = context->user->instPrimID[0];
                      uStack_2dc = local_2e0;
                      uStack_2d8 = local_2e0;
                      uStack_2d4 = local_2e0;
                      uStack_2d0 = local_2e0;
                      uStack_2cc = local_2e0;
                      uStack_2c8 = local_2e0;
                      uStack_2c4 = local_2e0;
                      *(float *)(ray + k * 4 + 0x100) = fVar151;
                      local_720 = local_460;
                      local_8d0.valid = (int *)local_720;
                      local_8d0.geometryUserPtr = pGVar2->userPtr;
                      local_8d0.context = context->user;
                      local_8d0.hit = local_3e0;
                      local_8d0.N = 8;
                      local_7c0._0_4_ = fVar165;
                      local_8d0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar254 = ZEXT1664(auVar74);
                        (*pGVar2->occlusionFilterN)(&local_8d0);
                        auVar244 = ZEXT3264(local_8a0);
                        auVar242 = ZEXT3264(local_880);
                        auVar238 = ZEXT3264(local_860);
                        auVar246 = ZEXT3264(local_840);
                        auVar251 = ZEXT3264(local_820);
                        auVar249 = ZEXT3264(local_800);
                        auVar255 = ZEXT3264(local_7e0);
                        fVar165 = (float)local_7c0._0_4_;
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar254 = ZEXT1664(auVar254._0_16_);
                          (*p_Var3)(&local_8d0);
                          auVar244 = ZEXT3264(local_8a0);
                          auVar242 = ZEXT3264(local_880);
                          auVar238 = ZEXT3264(local_860);
                          auVar246 = ZEXT3264(local_840);
                          auVar251 = ZEXT3264(local_820);
                          auVar249 = ZEXT3264(local_800);
                          auVar255 = ZEXT3264(local_7e0);
                          fVar165 = (float)local_7c0._0_4_;
                        }
                        uVar60 = vptestmd_avx512vl(local_720,local_720);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar60 & 1);
                        bVar5 = (bool)((byte)(uVar60 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar60 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar60 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar60 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar60 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar60 >> 6) & 1);
                        bVar11 = SUB81(uVar60 >> 7,0);
                        *(uint *)(local_8d0.ray + 0x100) =
                             (uint)bVar4 * auVar93._0_4_ |
                             (uint)!bVar4 * *(int *)(local_8d0.ray + 0x100);
                        *(uint *)(local_8d0.ray + 0x104) =
                             (uint)bVar5 * auVar93._4_4_ |
                             (uint)!bVar5 * *(int *)(local_8d0.ray + 0x104);
                        *(uint *)(local_8d0.ray + 0x108) =
                             (uint)bVar6 * auVar93._8_4_ |
                             (uint)!bVar6 * *(int *)(local_8d0.ray + 0x108);
                        *(uint *)(local_8d0.ray + 0x10c) =
                             (uint)bVar7 * auVar93._12_4_ |
                             (uint)!bVar7 * *(int *)(local_8d0.ray + 0x10c);
                        *(uint *)(local_8d0.ray + 0x110) =
                             (uint)bVar8 * auVar93._16_4_ |
                             (uint)!bVar8 * *(int *)(local_8d0.ray + 0x110);
                        *(uint *)(local_8d0.ray + 0x114) =
                             (uint)bVar9 * auVar93._20_4_ |
                             (uint)!bVar9 * *(int *)(local_8d0.ray + 0x114);
                        *(uint *)(local_8d0.ray + 0x118) =
                             (uint)bVar10 * auVar93._24_4_ |
                             (uint)!bVar10 * *(int *)(local_8d0.ray + 0x118);
                        *(uint *)(local_8d0.ray + 0x11c) =
                             (uint)bVar11 * auVar93._28_4_ |
                             (uint)!bVar11 * *(int *)(local_8d0.ray + 0x11c);
                        bVar61 = 1;
                        if (local_720 != (undefined1  [32])0x0) goto LAB_01a7db81;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar165;
                    }
                  }
                  bVar61 = 0;
                  goto LAB_01a7db81;
                }
              }
              uVar62 = uVar62 + 1;
              auVar238 = ZEXT3264(local_860);
              auVar242 = ZEXT3264(local_880);
              auVar244 = ZEXT3264(local_8a0);
            }
            bVar64 = false;
LAB_01a7db81:
            bVar56 = bVar56 | bVar64 & bVar61;
            uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar232._4_4_ = uVar153;
            auVar232._0_4_ = uVar153;
            auVar232._8_4_ = uVar153;
            auVar232._12_4_ = uVar153;
            auVar232._16_4_ = uVar153;
            auVar232._20_4_ = uVar153;
            auVar232._24_4_ = uVar153;
            auVar232._28_4_ = uVar153;
            auVar224 = ZEXT3264(auVar232);
            auVar51._4_4_ = fStack_49c;
            auVar51._0_4_ = local_4a0;
            auVar51._8_4_ = fStack_498;
            auVar51._12_4_ = fStack_494;
            auVar51._16_4_ = fStack_490;
            auVar51._20_4_ = fStack_48c;
            auVar51._24_4_ = fStack_488;
            auVar51._28_4_ = fStack_484;
            uVar13 = vcmpps_avx512vl(auVar232,auVar51,0xd);
          }
          uVar15 = vpcmpd_avx512vl(local_440,local_280,1);
          uVar14 = vpcmpd_avx512vl(local_440,_local_4c0,1);
          auVar162._0_4_ = (float)local_760._0_4_ + (float)local_1c0._0_4_;
          auVar162._4_4_ = (float)local_760._4_4_ + (float)local_1c0._4_4_;
          auVar162._8_4_ = fStack_758 + fStack_1b8;
          auVar162._12_4_ = fStack_754 + fStack_1b4;
          auVar162._16_4_ = fStack_750 + fStack_1b0;
          auVar162._20_4_ = fStack_74c + fStack_1ac;
          auVar162._24_4_ = fStack_748 + fStack_1a8;
          auVar162._28_4_ = fStack_744 + fStack_1a4;
          uVar153 = auVar224._0_4_;
          auVar198._4_4_ = uVar153;
          auVar198._0_4_ = uVar153;
          auVar198._8_4_ = uVar153;
          auVar198._12_4_ = uVar153;
          auVar198._16_4_ = uVar153;
          auVar198._20_4_ = uVar153;
          auVar198._24_4_ = uVar153;
          auVar198._28_4_ = uVar153;
          uVar13 = vcmpps_avx512vl(auVar162,auVar198,2);
          bVar58 = bVar58 & (byte)uVar15 & (byte)uVar13;
          auVar215._0_4_ = (float)local_760._0_4_ + (float)local_2c0._0_4_;
          auVar215._4_4_ = (float)local_760._4_4_ + (float)local_2c0._4_4_;
          auVar215._8_4_ = fStack_758 + fStack_2b8;
          auVar215._12_4_ = fStack_754 + fStack_2b4;
          auVar215._16_4_ = fStack_750 + fStack_2b0;
          auVar215._20_4_ = fStack_74c + fStack_2ac;
          auVar215._24_4_ = fStack_748 + fStack_2a8;
          auVar215._28_4_ = fStack_744 + fStack_2a4;
          uVar13 = vcmpps_avx512vl(auVar215,auVar198,2);
          bVar53 = bVar53 & (byte)uVar14 & (byte)uVar13 | bVar58;
          if (bVar53 != 0) {
            abStack_180[uVar57 * 0x60] = bVar53;
            bVar64 = (bool)(bVar58 >> 1 & 1);
            bVar4 = (bool)(bVar58 >> 2 & 1);
            bVar5 = (bool)(bVar58 >> 3 & 1);
            bVar6 = (bool)(bVar58 >> 4 & 1);
            bVar7 = (bool)(bVar58 >> 5 & 1);
            auStack_160[uVar57 * 0x18] =
                 (uint)(bVar58 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar58 & 1) * local_2c0._0_4_;
            auStack_160[uVar57 * 0x18 + 1] =
                 (uint)bVar64 * local_1c0._4_4_ | (uint)!bVar64 * local_2c0._4_4_;
            auStack_160[uVar57 * 0x18 + 2] =
                 (uint)bVar4 * (int)fStack_1b8 | (uint)!bVar4 * (int)fStack_2b8;
            auStack_160[uVar57 * 0x18 + 3] =
                 (uint)bVar5 * (int)fStack_1b4 | (uint)!bVar5 * (int)fStack_2b4;
            auStack_160[uVar57 * 0x18 + 4] =
                 (uint)bVar6 * (int)fStack_1b0 | (uint)!bVar6 * (int)fStack_2b0;
            auStack_160[uVar57 * 0x18 + 5] =
                 (uint)bVar7 * (int)fStack_1ac | (uint)!bVar7 * (int)fStack_2ac;
            auStack_160[uVar57 * 0x18 + 6] =
                 (uint)(bVar58 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar58 >> 6) * (int)fStack_2a8;
            (&fStack_144)[uVar57 * 0x18] = fStack_2a4;
            uVar60 = vmovlps_avx(local_470);
            (&uStack_140)[uVar57 * 0xc] = uVar60;
            aiStack_138[uVar57 * 0x18] = local_adc + 1;
            uVar57 = (ulong)((int)uVar57 + 1);
          }
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar257 = ZEXT3264(auVar93);
          auVar224 = ZEXT3264(_DAT_01f7b040);
          fVar151 = (float)local_760._0_4_;
          fVar165 = (float)local_760._4_4_;
          fVar167 = fStack_758;
          fVar169 = fStack_754;
          fVar137 = fStack_750;
          fVar171 = fStack_74c;
          fVar200 = fStack_748;
          fVar174 = fStack_744;
        }
      }
    }
    do {
      uVar67 = (uint)uVar57;
      uVar57 = (ulong)(uVar67 - 1);
      if (uVar67 == 0) {
        if (bVar56 != 0) goto LAB_01a7e24a;
        uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar33._4_4_ = uVar153;
        auVar33._0_4_ = uVar153;
        auVar33._8_4_ = uVar153;
        auVar33._12_4_ = uVar153;
        auVar33._16_4_ = uVar153;
        auVar33._20_4_ = uVar153;
        auVar33._24_4_ = uVar153;
        auVar33._28_4_ = uVar153;
        uVar13 = vcmpps_avx512vl(local_260,auVar33,2);
        uVar63 = (ulong)((uint)local_688 & (uint)uVar13);
        goto LAB_01a7b8e2;
      }
      auVar93 = *(undefined1 (*) [32])(auStack_160 + uVar57 * 0x18);
      auVar163._0_4_ = fVar151 + auVar93._0_4_;
      auVar163._4_4_ = fVar165 + auVar93._4_4_;
      auVar163._8_4_ = fVar167 + auVar93._8_4_;
      auVar163._12_4_ = fVar169 + auVar93._12_4_;
      auVar163._16_4_ = fVar137 + auVar93._16_4_;
      auVar163._20_4_ = fVar171 + auVar93._20_4_;
      auVar163._24_4_ = fVar200 + auVar93._24_4_;
      auVar163._28_4_ = fVar174 + auVar93._28_4_;
      uVar153 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar153;
      auVar32._0_4_ = uVar153;
      auVar32._8_4_ = uVar153;
      auVar32._12_4_ = uVar153;
      auVar32._16_4_ = uVar153;
      auVar32._20_4_ = uVar153;
      auVar32._24_4_ = uVar153;
      auVar32._28_4_ = uVar153;
      uVar13 = vcmpps_avx512vl(auVar163,auVar32,2);
      uVar129 = (uint)uVar13 & (uint)abStack_180[uVar57 * 0x60];
    } while (uVar129 == 0);
    uVar60 = (&uStack_140)[uVar57 * 0xc];
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar60;
    auVar199._8_4_ = 0x7f800000;
    auVar199._0_8_ = 0x7f8000007f800000;
    auVar199._12_4_ = 0x7f800000;
    auVar199._16_4_ = 0x7f800000;
    auVar199._20_4_ = 0x7f800000;
    auVar199._24_4_ = 0x7f800000;
    auVar199._28_4_ = 0x7f800000;
    auVar94 = vblendmps_avx512vl(auVar199,auVar93);
    bVar53 = (byte)uVar129;
    auVar128._0_4_ =
         (uint)(bVar53 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)auVar93._0_4_;
    bVar64 = (bool)((byte)(uVar129 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar64 * auVar94._4_4_ | (uint)!bVar64 * (int)auVar93._4_4_;
    bVar64 = (bool)((byte)(uVar129 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar64 * auVar94._8_4_ | (uint)!bVar64 * (int)auVar93._8_4_;
    bVar64 = (bool)((byte)(uVar129 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar64 * auVar94._12_4_ | (uint)!bVar64 * (int)auVar93._12_4_;
    bVar64 = (bool)((byte)(uVar129 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar64 * auVar94._16_4_ | (uint)!bVar64 * (int)auVar93._16_4_;
    bVar64 = (bool)((byte)(uVar129 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar64 * auVar94._20_4_ | (uint)!bVar64 * (int)auVar93._20_4_;
    bVar64 = (bool)((byte)(uVar129 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar64 * auVar94._24_4_ | (uint)!bVar64 * (int)auVar93._24_4_;
    auVar128._28_4_ =
         (uVar129 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar129 >> 7,0) * (int)auVar93._28_4_;
    auVar93 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar93 = vminps_avx(auVar128,auVar93);
    auVar94 = vshufpd_avx(auVar93,auVar93,5);
    auVar93 = vminps_avx(auVar93,auVar94);
    auVar94 = vpermpd_avx2(auVar93,0x4e);
    auVar93 = vminps_avx(auVar93,auVar94);
    uVar13 = vcmpps_avx512vl(auVar128,auVar93,0);
    bVar59 = (byte)uVar13 & bVar53;
    if (bVar59 != 0) {
      uVar129 = (uint)bVar59;
    }
    uVar130 = 0;
    for (; (uVar129 & 1) == 0; uVar129 = uVar129 >> 1 | 0x80000000) {
      uVar130 = uVar130 + 1;
    }
    local_adc = aiStack_138[uVar57 * 0x18];
    bVar53 = ~('\x01' << ((byte)uVar130 & 0x1f)) & bVar53;
    abStack_180[uVar57 * 0x60] = bVar53;
    if (bVar53 == 0) {
      uVar67 = uVar67 - 1;
    }
    uVar153 = (undefined4)uVar60;
    auVar150._4_4_ = uVar153;
    auVar150._0_4_ = uVar153;
    auVar150._8_4_ = uVar153;
    auVar150._12_4_ = uVar153;
    auVar150._16_4_ = uVar153;
    auVar150._20_4_ = uVar153;
    auVar150._24_4_ = uVar153;
    auVar150._28_4_ = uVar153;
    auVar71 = vmovshdup_avx(auVar160);
    auVar71 = vsubps_avx(auVar71,auVar160);
    auVar164._0_4_ = auVar71._0_4_;
    auVar164._4_4_ = auVar164._0_4_;
    auVar164._8_4_ = auVar164._0_4_;
    auVar164._12_4_ = auVar164._0_4_;
    auVar164._16_4_ = auVar164._0_4_;
    auVar164._20_4_ = auVar164._0_4_;
    auVar164._24_4_ = auVar164._0_4_;
    auVar164._28_4_ = auVar164._0_4_;
    auVar71 = vfmadd132ps_fma(auVar164,auVar150,auVar224._0_32_);
    auVar93 = ZEXT1632(auVar71);
    local_3e0[0] = (RTCHitN)auVar93[0];
    local_3e0[1] = (RTCHitN)auVar93[1];
    local_3e0[2] = (RTCHitN)auVar93[2];
    local_3e0[3] = (RTCHitN)auVar93[3];
    local_3e0[4] = (RTCHitN)auVar93[4];
    local_3e0[5] = (RTCHitN)auVar93[5];
    local_3e0[6] = (RTCHitN)auVar93[6];
    local_3e0[7] = (RTCHitN)auVar93[7];
    local_3e0[8] = (RTCHitN)auVar93[8];
    local_3e0[9] = (RTCHitN)auVar93[9];
    local_3e0[10] = (RTCHitN)auVar93[10];
    local_3e0[0xb] = (RTCHitN)auVar93[0xb];
    local_3e0[0xc] = (RTCHitN)auVar93[0xc];
    local_3e0[0xd] = (RTCHitN)auVar93[0xd];
    local_3e0[0xe] = (RTCHitN)auVar93[0xe];
    local_3e0[0xf] = (RTCHitN)auVar93[0xf];
    local_3e0[0x10] = (RTCHitN)auVar93[0x10];
    local_3e0[0x11] = (RTCHitN)auVar93[0x11];
    local_3e0[0x12] = (RTCHitN)auVar93[0x12];
    local_3e0[0x13] = (RTCHitN)auVar93[0x13];
    local_3e0[0x14] = (RTCHitN)auVar93[0x14];
    local_3e0[0x15] = (RTCHitN)auVar93[0x15];
    local_3e0[0x16] = (RTCHitN)auVar93[0x16];
    local_3e0[0x17] = (RTCHitN)auVar93[0x17];
    local_3e0[0x18] = (RTCHitN)auVar93[0x18];
    local_3e0[0x19] = (RTCHitN)auVar93[0x19];
    local_3e0[0x1a] = (RTCHitN)auVar93[0x1a];
    local_3e0[0x1b] = (RTCHitN)auVar93[0x1b];
    local_3e0[0x1c] = (RTCHitN)auVar93[0x1c];
    local_3e0[0x1d] = (RTCHitN)auVar93[0x1d];
    local_3e0[0x1e] = (RTCHitN)auVar93[0x1e];
    local_3e0[0x1f] = (RTCHitN)auVar93[0x1f];
    local_470._8_8_ = 0;
    local_470._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar130 * 4);
    uVar57 = (ulong)uVar67;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }